

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<4,16>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  byte bVar47;
  byte bVar48;
  byte bVar49;
  ulong uVar50;
  byte bVar51;
  long lVar52;
  uint uVar53;
  byte bVar54;
  ulong uVar55;
  bool bVar56;
  byte bVar57;
  uint uVar58;
  bool bVar59;
  ulong uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar135;
  uint uVar136;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  uint uVar138;
  uint uVar139;
  uint uVar140;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  uint uVar137;
  uint uVar141;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar134 [64];
  float fVar160;
  float fVar161;
  vint4 bi_2;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar162;
  vint4 bi_1;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar165 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar180;
  vint4 bi;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar205;
  float fVar221;
  float fVar222;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar220 [32];
  float fVar227;
  vint4 ai_2;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  vint4 ai;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  float fVar244;
  vint4 ai_1;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar245;
  float fVar246;
  float fVar247;
  undefined1 auVar243 [32];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [64];
  float fVar253;
  float fVar259;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar257;
  float fVar258;
  undefined1 auVar256 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  float s;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  int local_cfc;
  RTCFilterFunctionNArguments local_a70;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_930 [16];
  undefined1 local_920 [16];
  float local_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [16];
  Primitive *local_8f0;
  ulong local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_760 [32];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  undefined1 auVar130 [64];
  undefined1 auVar133 [64];
  
  PVar1 = prim[1];
  uVar55 = (ulong)(byte)PVar1;
  fVar227 = *(float *)(prim + uVar55 * 0x19 + 0x12);
  auVar66 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar66 = vinsertps_avx(auVar66,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar64 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar64 = vinsertps_avx(auVar64,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar66 = vsubps_avx(auVar66,*(undefined1 (*) [16])(prim + uVar55 * 0x19 + 6));
  auVar206._0_4_ = fVar227 * auVar66._0_4_;
  auVar206._4_4_ = fVar227 * auVar66._4_4_;
  auVar206._8_4_ = fVar227 * auVar66._8_4_;
  auVar206._12_4_ = fVar227 * auVar66._12_4_;
  auVar142._0_4_ = fVar227 * auVar64._0_4_;
  auVar142._4_4_ = fVar227 * auVar64._4_4_;
  auVar142._8_4_ = fVar227 * auVar64._8_4_;
  auVar142._12_4_ = fVar227 * auVar64._12_4_;
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 4 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 5 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 6 + 6)));
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 * 0xb + 6)));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar1 * 0xc + uVar55 + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  uVar60 = (ulong)(uint)((int)(uVar55 * 9) * 2);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 + uVar55 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  uVar50 = (ulong)(uint)((int)(uVar55 * 5) << 2);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar50 + 6)));
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar267._4_4_ = auVar142._0_4_;
  auVar267._0_4_ = auVar142._0_4_;
  auVar267._8_4_ = auVar142._0_4_;
  auVar267._12_4_ = auVar142._0_4_;
  auVar72 = vshufps_avx(auVar142,auVar142,0x55);
  auVar65 = vshufps_avx(auVar142,auVar142,0xaa);
  fVar227 = auVar65._0_4_;
  auVar181._0_4_ = fVar227 * auVar67._0_4_;
  fVar160 = auVar65._4_4_;
  auVar181._4_4_ = fVar160 * auVar67._4_4_;
  fVar161 = auVar65._8_4_;
  auVar181._8_4_ = fVar161 * auVar67._8_4_;
  fVar205 = auVar65._12_4_;
  auVar181._12_4_ = fVar205 * auVar67._12_4_;
  auVar163._0_4_ = auVar68._0_4_ * fVar227;
  auVar163._4_4_ = auVar68._4_4_ * fVar160;
  auVar163._8_4_ = auVar68._8_4_ * fVar161;
  auVar163._12_4_ = auVar68._12_4_ * fVar205;
  auVar74._0_4_ = auVar71._0_4_ * fVar227;
  auVar74._4_4_ = auVar71._4_4_ * fVar160;
  auVar74._8_4_ = auVar71._8_4_ * fVar161;
  auVar74._12_4_ = auVar71._12_4_ * fVar205;
  auVar65 = vfmadd231ps_fma(auVar181,auVar72,auVar64);
  auVar73 = vfmadd231ps_fma(auVar163,auVar72,auVar11);
  auVar72 = vfmadd231ps_fma(auVar74,auVar70,auVar72);
  auVar63 = vfmadd231ps_fma(auVar65,auVar267,auVar66);
  auVar73 = vfmadd231ps_fma(auVar73,auVar267,auVar69);
  auVar142 = vfmadd231ps_fma(auVar72,auVar75,auVar267);
  auVar268._4_4_ = auVar206._0_4_;
  auVar268._0_4_ = auVar206._0_4_;
  auVar268._8_4_ = auVar206._0_4_;
  auVar268._12_4_ = auVar206._0_4_;
  auVar72 = vshufps_avx(auVar206,auVar206,0x55);
  auVar65 = vshufps_avx(auVar206,auVar206,0xaa);
  fVar227 = auVar65._0_4_;
  auVar271._0_4_ = fVar227 * auVar67._0_4_;
  fVar160 = auVar65._4_4_;
  auVar271._4_4_ = fVar160 * auVar67._4_4_;
  fVar161 = auVar65._8_4_;
  auVar271._8_4_ = fVar161 * auVar67._8_4_;
  fVar205 = auVar65._12_4_;
  auVar271._12_4_ = fVar205 * auVar67._12_4_;
  auVar228._0_4_ = auVar68._0_4_ * fVar227;
  auVar228._4_4_ = auVar68._4_4_ * fVar160;
  auVar228._8_4_ = auVar68._8_4_ * fVar161;
  auVar228._12_4_ = auVar68._12_4_ * fVar205;
  auVar207._0_4_ = auVar71._0_4_ * fVar227;
  auVar207._4_4_ = auVar71._4_4_ * fVar160;
  auVar207._8_4_ = auVar71._8_4_ * fVar161;
  auVar207._12_4_ = auVar71._12_4_ * fVar205;
  auVar64 = vfmadd231ps_fma(auVar271,auVar72,auVar64);
  auVar67 = vfmadd231ps_fma(auVar228,auVar72,auVar11);
  auVar11 = vfmadd231ps_fma(auVar207,auVar72,auVar70);
  auVar68 = vfmadd231ps_fma(auVar64,auVar268,auVar66);
  auVar70 = vfmadd231ps_fma(auVar67,auVar268,auVar69);
  auVar248._8_4_ = 0x7fffffff;
  auVar248._0_8_ = 0x7fffffff7fffffff;
  auVar248._12_4_ = 0x7fffffff;
  auVar71 = vfmadd231ps_fma(auVar11,auVar268,auVar75);
  auVar66 = vandps_avx(auVar63,auVar248);
  auVar238._8_4_ = 0x219392ef;
  auVar238._0_8_ = 0x219392ef219392ef;
  auVar238._12_4_ = 0x219392ef;
  uVar60 = vcmpps_avx512vl(auVar66,auVar238,1);
  bVar56 = (bool)((byte)uVar60 & 1);
  auVar65._0_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar63._0_4_;
  bVar56 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar65._4_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar63._4_4_;
  bVar56 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar65._8_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar63._8_4_;
  bVar56 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar65._12_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar63._12_4_;
  auVar66 = vandps_avx(auVar73,auVar248);
  uVar60 = vcmpps_avx512vl(auVar66,auVar238,1);
  bVar56 = (bool)((byte)uVar60 & 1);
  auVar63._0_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar73._0_4_;
  bVar56 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar63._4_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar73._4_4_;
  bVar56 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar63._8_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar73._8_4_;
  bVar56 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar63._12_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar73._12_4_;
  auVar66 = vandps_avx(auVar142,auVar248);
  uVar60 = vcmpps_avx512vl(auVar66,auVar238,1);
  bVar56 = (bool)((byte)uVar60 & 1);
  auVar73._0_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar142._0_4_;
  bVar56 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar73._4_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar142._4_4_;
  bVar56 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar73._8_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar142._8_4_;
  bVar56 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar73._12_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar142._12_4_;
  auVar64 = vrcp14ps_avx512vl(auVar65);
  auVar239._8_4_ = 0x3f800000;
  auVar239._0_8_ = 0x3f8000003f800000;
  auVar239._12_4_ = 0x3f800000;
  auVar66 = vfnmadd213ps_fma(auVar65,auVar64,auVar239);
  auVar69 = vfmadd132ps_fma(auVar66,auVar64,auVar64);
  auVar64 = vrcp14ps_avx512vl(auVar63);
  auVar66 = vfnmadd213ps_fma(auVar63,auVar64,auVar239);
  auVar11 = vfmadd132ps_fma(auVar66,auVar64,auVar64);
  auVar64 = vrcp14ps_avx512vl(auVar73);
  auVar66 = vfnmadd213ps_fma(auVar73,auVar64,auVar239);
  auVar75 = vfmadd132ps_fma(auVar66,auVar64,auVar64);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar55 * 7 + 6);
  auVar66 = vpmovsxwd_avx(auVar66);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx(auVar66,auVar68);
  auVar233._0_4_ = auVar69._0_4_ * auVar66._0_4_;
  auVar233._4_4_ = auVar69._4_4_ * auVar66._4_4_;
  auVar233._8_4_ = auVar69._8_4_ * auVar66._8_4_;
  auVar233._12_4_ = auVar69._12_4_ * auVar66._12_4_;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar55 * 9 + 6);
  auVar66 = vpmovsxwd_avx(auVar64);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx(auVar66,auVar68);
  auVar65 = vpbroadcastd_avx512vl();
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar64 = vpmovsxwd_avx(auVar67);
  auVar182._0_4_ = auVar69._0_4_ * auVar66._0_4_;
  auVar182._4_4_ = auVar69._4_4_ * auVar66._4_4_;
  auVar182._8_4_ = auVar69._8_4_ * auVar66._8_4_;
  auVar182._12_4_ = auVar69._12_4_ * auVar66._12_4_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + uVar55 * -2 + 6);
  auVar66 = vpmovsxwd_avx(auVar69);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx(auVar66,auVar70);
  auVar240._0_4_ = auVar11._0_4_ * auVar66._0_4_;
  auVar240._4_4_ = auVar11._4_4_ * auVar66._4_4_;
  auVar240._8_4_ = auVar11._8_4_ * auVar66._8_4_;
  auVar240._12_4_ = auVar11._12_4_ * auVar66._12_4_;
  auVar66 = vcvtdq2ps_avx(auVar64);
  auVar66 = vsubps_avx(auVar66,auVar70);
  auVar164._0_4_ = auVar11._0_4_ * auVar66._0_4_;
  auVar164._4_4_ = auVar11._4_4_ * auVar66._4_4_;
  auVar164._8_4_ = auVar11._8_4_ * auVar66._8_4_;
  auVar164._12_4_ = auVar11._12_4_ * auVar66._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar50 + uVar55 + 6);
  auVar66 = vpmovsxwd_avx(auVar11);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx(auVar66,auVar71);
  auVar229._0_4_ = auVar75._0_4_ * auVar66._0_4_;
  auVar229._4_4_ = auVar75._4_4_ * auVar66._4_4_;
  auVar229._8_4_ = auVar75._8_4_ * auVar66._8_4_;
  auVar229._12_4_ = auVar75._12_4_ * auVar66._12_4_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar55 * 0x17 + 6);
  auVar66 = vpmovsxwd_avx(auVar68);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx(auVar66,auVar71);
  auVar143._0_4_ = auVar75._0_4_ * auVar66._0_4_;
  auVar143._4_4_ = auVar75._4_4_ * auVar66._4_4_;
  auVar143._8_4_ = auVar75._8_4_ * auVar66._8_4_;
  auVar143._12_4_ = auVar75._12_4_ * auVar66._12_4_;
  auVar66 = vpminsd_avx(auVar233,auVar182);
  auVar64 = vpminsd_avx(auVar240,auVar164);
  auVar66 = vmaxps_avx(auVar66,auVar64);
  auVar64 = vpminsd_avx(auVar229,auVar143);
  uVar162 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar75._4_4_ = uVar162;
  auVar75._0_4_ = uVar162;
  auVar75._8_4_ = uVar162;
  auVar75._12_4_ = uVar162;
  auVar64 = vmaxps_avx512vl(auVar64,auVar75);
  auVar66 = vmaxps_avx(auVar66,auVar64);
  auVar70._8_4_ = 0x3f7ffffa;
  auVar70._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar70._12_4_ = 0x3f7ffffa;
  local_720 = vmulps_avx512vl(auVar66,auVar70);
  auVar66 = vpmaxsd_avx(auVar233,auVar182);
  auVar64 = vpmaxsd_avx(auVar240,auVar164);
  auVar66 = vminps_avx(auVar66,auVar64);
  auVar64 = vpmaxsd_avx(auVar229,auVar143);
  uVar162 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar71._4_4_ = uVar162;
  auVar71._0_4_ = uVar162;
  auVar71._8_4_ = uVar162;
  auVar71._12_4_ = uVar162;
  auVar64 = vminps_avx512vl(auVar64,auVar71);
  auVar66 = vminps_avx(auVar66,auVar64);
  auVar72._8_4_ = 0x3f800003;
  auVar72._0_8_ = 0x3f8000033f800003;
  auVar72._12_4_ = 0x3f800003;
  auVar66 = vmulps_avx512vl(auVar66,auVar72);
  uVar12 = vcmpps_avx512vl(local_720,auVar66,2);
  local_8e8 = vpcmpgtd_avx512vl(auVar65,_DAT_01f7fcf0);
  local_8e8 = ((byte)uVar12 & 0xf) & local_8e8;
  if ((char)local_8e8 == '\0') {
    return false;
  }
  auVar159 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_500 = vmovdqa64_avx512f(auVar159);
  local_8f0 = prim;
LAB_01ac9fd8:
  lVar52 = 0;
  for (uVar60 = local_8e8; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
    lVar52 = lVar52 + 1;
  }
  uVar58 = *(uint *)(prim + 2);
  pGVar2 = (context->scene->geometries).items[uVar58].ptr;
  uVar60 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar52 * 4 + 6));
  p_Var3 = pGVar2[1].intersectionFilterN;
  lVar52 = *(long *)&pGVar2[1].time_range.upper;
  auVar66 = *(undefined1 (*) [16])(lVar52 + (long)p_Var3 * uVar60);
  auVar64 = *(undefined1 (*) [16])(lVar52 + (uVar60 + 1) * (long)p_Var3);
  local_8e8 = local_8e8 - 1 & local_8e8;
  if (local_8e8 != 0) {
    uVar55 = local_8e8 - 1 & local_8e8;
    for (uVar50 = local_8e8; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
    }
    if (uVar55 != 0) {
      for (; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar67 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar69 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar162 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar263._4_4_ = uVar162;
  auVar263._0_4_ = uVar162;
  auVar263._8_4_ = uVar162;
  auVar263._12_4_ = uVar162;
  fStack_810 = (float)uVar162;
  _local_820 = auVar263;
  fStack_80c = (float)uVar162;
  fStack_808 = (float)uVar162;
  register0x0000151c = uVar162;
  uVar162 = *(undefined4 *)(ray + k * 4 + 0x140);
  auVar269._4_4_ = uVar162;
  auVar269._0_4_ = uVar162;
  auVar269._8_4_ = uVar162;
  auVar269._12_4_ = uVar162;
  local_840._16_4_ = uVar162;
  local_840._0_16_ = auVar269;
  local_840._20_4_ = uVar162;
  local_840._24_4_ = uVar162;
  local_840._28_4_ = uVar162;
  auVar67 = vunpcklps_avx(auVar263,auVar269);
  fVar227 = *(float *)(ray + k * 4 + 0x180);
  auVar270._4_4_ = fVar227;
  auVar270._0_4_ = fVar227;
  auVar270._8_4_ = fVar227;
  auVar270._12_4_ = fVar227;
  local_860._16_4_ = fVar227;
  local_860._0_16_ = auVar270;
  local_860._20_4_ = fVar227;
  local_860._24_4_ = fVar227;
  local_860._28_4_ = fVar227;
  local_9d0 = vinsertps_avx(auVar67,auVar270,0x28);
  auVar234._0_4_ = auVar66._0_4_ + auVar64._0_4_;
  auVar234._4_4_ = auVar66._4_4_ + auVar64._4_4_;
  auVar234._8_4_ = auVar66._8_4_ + auVar64._8_4_;
  auVar234._12_4_ = auVar66._12_4_ + auVar64._12_4_;
  auVar16._8_4_ = 0x3f000000;
  auVar16._0_8_ = 0x3f0000003f000000;
  auVar16._12_4_ = 0x3f000000;
  auVar67 = vmulps_avx512vl(auVar234,auVar16);
  auVar67 = vsubps_avx(auVar67,auVar69);
  auVar67 = vdpps_avx(auVar67,local_9d0,0x7f);
  fVar160 = *(float *)(ray + k * 4 + 0xc0);
  auVar261 = ZEXT464((uint)fVar160);
  local_9e0 = vdpps_avx(local_9d0,local_9d0,0x7f);
  auVar262 = ZEXT1664(local_9e0);
  auVar241._4_12_ = ZEXT812(0) << 0x20;
  auVar241._0_4_ = local_9e0._0_4_;
  auVar68 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar241);
  auVar11 = vfnmadd213ss_fma(auVar68,local_9e0,ZEXT416(0x40000000));
  fVar161 = auVar67._0_4_ * auVar68._0_4_ * auVar11._0_4_;
  auVar242._4_4_ = fVar161;
  auVar242._0_4_ = fVar161;
  auVar242._8_4_ = fVar161;
  auVar242._12_4_ = fVar161;
  auVar67 = vfmadd231ps_fma(auVar69,local_9d0,auVar242);
  auVar67 = vblendps_avx(auVar67,ZEXT816(0) << 0x40,8);
  auVar66 = vsubps_avx(auVar66,auVar67);
  auVar69 = vsubps_avx(*(undefined1 (*) [16])(lVar52 + (uVar60 + 2) * (long)p_Var3),auVar67);
  auVar252 = ZEXT1664(auVar69);
  auVar64 = vsubps_avx(auVar64,auVar67);
  auVar256 = ZEXT1664(auVar64);
  auVar67 = vsubps_avx(*(undefined1 (*) [16])(lVar52 + (uVar60 + 3) * (long)p_Var3),auVar67);
  auVar76 = vbroadcastss_avx512vl(auVar66);
  auVar87._8_4_ = 1;
  auVar87._0_8_ = 0x100000001;
  auVar87._12_4_ = 1;
  auVar87._16_4_ = 1;
  auVar87._20_4_ = 1;
  auVar87._24_4_ = 1;
  auVar87._28_4_ = 1;
  local_960 = ZEXT1632(auVar66);
  auVar77 = vpermps_avx512vl(auVar87,local_960);
  auVar88._8_4_ = 2;
  auVar88._0_8_ = 0x200000002;
  auVar88._12_4_ = 2;
  auVar88._16_4_ = 2;
  auVar88._20_4_ = 2;
  auVar88._24_4_ = 2;
  auVar88._28_4_ = 2;
  auVar78 = vpermps_avx512vl(auVar88,local_960);
  auVar89._8_4_ = 3;
  auVar89._0_8_ = 0x300000003;
  auVar89._12_4_ = 3;
  auVar89._16_4_ = 3;
  auVar89._20_4_ = 3;
  auVar89._24_4_ = 3;
  auVar89._28_4_ = 3;
  auVar79 = vpermps_avx512vl(auVar89,local_960);
  auVar80 = vbroadcastss_avx512vl(auVar64);
  local_9a0 = ZEXT1632(auVar64);
  auVar81 = vpermps_avx512vl(auVar87,local_9a0);
  auVar82 = vpermps_avx512vl(auVar88,local_9a0);
  auVar83 = vpermps_avx512vl(auVar89,local_9a0);
  auVar84 = vbroadcastss_avx512vl(auVar69);
  local_980 = ZEXT1632(auVar69);
  auVar85 = vpermps_avx512vl(auVar87,local_980);
  local_5c0 = vpermps_avx512vl(auVar88,local_980);
  local_5e0 = vpermps_avx512vl(auVar89,local_980);
  local_5a0 = vbroadcastss_avx512vl(auVar67);
  _local_9c0 = ZEXT1632(auVar67);
  local_620 = vpermps_avx2(auVar87,_local_9c0);
  local_560 = vpermps_avx2(auVar88,_local_9c0);
  local_640 = vpermps_avx2(auVar89,_local_9c0);
  auVar66 = vfmadd231ps_fma(ZEXT432((uint)(fVar227 * fVar227)),local_840,local_840);
  auVar66 = vfmadd231ps_fma(ZEXT1632(auVar66),_local_820,_local_820);
  local_580._0_4_ = auVar66._0_4_;
  local_580._4_4_ = local_580._0_4_;
  local_580._8_4_ = local_580._0_4_;
  local_580._12_4_ = local_580._0_4_;
  local_580._16_4_ = local_580._0_4_;
  local_580._20_4_ = local_580._0_4_;
  local_580._24_4_ = local_580._0_4_;
  local_580._28_4_ = local_580._0_4_;
  auVar86._8_4_ = 0x7fffffff;
  auVar86._0_8_ = 0x7fffffff7fffffff;
  auVar86._12_4_ = 0x7fffffff;
  auVar86._16_4_ = 0x7fffffff;
  auVar86._20_4_ = 0x7fffffff;
  auVar86._24_4_ = 0x7fffffff;
  auVar86._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_580,auVar86);
  local_930 = ZEXT416((uint)fVar161);
  local_660 = fVar160 - fVar161;
  fStack_65c = local_660;
  fStack_658 = local_660;
  fStack_654 = local_660;
  fStack_650 = local_660;
  fStack_64c = local_660;
  fStack_648 = local_660;
  fStack_644 = local_660;
  auVar159 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar159);
  local_cfc = 1;
  uVar53 = 0;
  bVar56 = false;
  auVar159 = vpbroadcastd_avx512f();
  local_4c0 = vmovdqa64_avx512f(auVar159);
  auVar66 = vsqrtss_avx(local_9e0,local_9e0);
  auVar64 = vsqrtss_avx(local_9e0,local_9e0);
  local_710 = ZEXT816(0x3f80000000000000);
  local_600 = local_5a0;
  do {
    auVar67 = vmovshdup_avx(local_710);
    auVar67 = vsubps_avx(auVar67,local_710);
    auVar152._0_4_ = auVar67._0_4_;
    fVar227 = auVar152._0_4_ * 0.04761905;
    uVar162 = local_710._0_4_;
    auVar232._4_4_ = uVar162;
    auVar232._0_4_ = uVar162;
    auVar232._8_4_ = uVar162;
    auVar232._12_4_ = uVar162;
    auVar232._16_4_ = uVar162;
    auVar232._20_4_ = uVar162;
    auVar232._24_4_ = uVar162;
    auVar232._28_4_ = uVar162;
    auVar152._4_4_ = auVar152._0_4_;
    auVar152._8_4_ = auVar152._0_4_;
    auVar152._12_4_ = auVar152._0_4_;
    auVar152._16_4_ = auVar152._0_4_;
    auVar152._20_4_ = auVar152._0_4_;
    auVar152._24_4_ = auVar152._0_4_;
    auVar152._28_4_ = auVar152._0_4_;
    auVar67 = vfmadd231ps_fma(auVar232,auVar152,_DAT_01faff20);
    auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar86 = vsubps_avx512vl(auVar86,ZEXT1632(auVar67));
    fVar205 = auVar67._0_4_;
    fVar221 = auVar67._4_4_;
    fVar222 = auVar67._8_4_;
    fVar223 = auVar67._12_4_;
    fVar225 = auVar86._0_4_;
    fVar226 = auVar86._4_4_;
    fVar244 = auVar86._8_4_;
    fVar245 = auVar86._12_4_;
    fVar246 = auVar86._16_4_;
    fVar180 = auVar86._20_4_;
    fVar247 = auVar86._24_4_;
    auVar91._4_4_ = fVar226 * fVar226 * -fVar221;
    auVar91._0_4_ = fVar225 * fVar225 * -fVar205;
    auVar91._8_4_ = fVar244 * fVar244 * -fVar222;
    auVar91._12_4_ = fVar245 * fVar245 * -fVar223;
    auVar91._16_4_ = fVar246 * fVar246 * -0.0;
    auVar91._20_4_ = fVar180 * fVar180 * -0.0;
    auVar91._24_4_ = fVar247 * fVar247 * -0.0;
    auVar91._28_4_ = 0x80000000;
    auVar159._28_36_ = auVar252._28_36_;
    auVar159._0_28_ =
         ZEXT1628(CONCAT412(fVar223 * fVar223,
                            CONCAT48(fVar222 * fVar222,CONCAT44(fVar221 * fVar221,fVar205 * fVar205)
                                    )));
    fVar253 = fVar205 * 3.0;
    fVar257 = fVar221 * 3.0;
    fVar258 = fVar222 * 3.0;
    fVar259 = fVar223 * 3.0;
    auVar252._28_36_ = auVar256._28_36_;
    auVar252._0_28_ = ZEXT1628(CONCAT412(fVar259,CONCAT48(fVar258,CONCAT44(fVar257,fVar253))));
    auVar108._0_4_ = (fVar253 + -5.0) * fVar205 * fVar205;
    auVar108._4_4_ = (fVar257 + -5.0) * fVar221 * fVar221;
    auVar108._8_4_ = (fVar258 + -5.0) * fVar222 * fVar222;
    auVar108._12_4_ = (fVar259 + -5.0) * fVar223 * fVar223;
    auVar108._16_4_ = 0x80000000;
    auVar108._20_4_ = 0x80000000;
    auVar108._24_4_ = 0x80000000;
    auVar108._28_4_ = 0;
    auVar87 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
    auVar88 = vaddps_avx512vl(auVar108,auVar87);
    auVar260._0_4_ = fVar225 * fVar225;
    auVar260._4_4_ = fVar226 * fVar226;
    auVar260._8_4_ = fVar244 * fVar244;
    auVar260._12_4_ = fVar245 * fVar245;
    auVar260._16_4_ = fVar246 * fVar246;
    auVar260._20_4_ = fVar180 * fVar180;
    auVar260._28_36_ = auVar261._28_36_;
    auVar260._24_4_ = fVar247 * fVar247;
    auVar94._4_4_ = auVar260._4_4_ * (fVar226 * 3.0 + -5.0);
    auVar94._0_4_ = auVar260._0_4_ * (fVar225 * 3.0 + -5.0);
    auVar94._8_4_ = auVar260._8_4_ * (fVar244 * 3.0 + -5.0);
    auVar94._12_4_ = auVar260._12_4_ * (fVar245 * 3.0 + -5.0);
    auVar94._16_4_ = auVar260._16_4_ * (fVar246 * 3.0 + -5.0);
    auVar94._20_4_ = auVar260._20_4_ * (fVar180 * 3.0 + -5.0);
    auVar94._24_4_ = auVar260._24_4_ * (fVar247 * 3.0 + -5.0);
    auVar94._28_4_ = auVar262._28_4_ + -5.0;
    auVar89 = vaddps_avx512vl(auVar94,auVar87);
    fVar224 = auVar86._28_4_;
    auVar95._4_4_ = fVar221 * fVar221 * -fVar226;
    auVar95._0_4_ = fVar205 * fVar205 * -fVar225;
    auVar95._8_4_ = fVar222 * fVar222 * -fVar244;
    auVar95._12_4_ = fVar223 * fVar223 * -fVar245;
    auVar95._16_4_ = -fVar246 * 0.0 * 0.0;
    auVar95._20_4_ = -fVar180 * 0.0 * 0.0;
    auVar95._24_4_ = -fVar247 * 0.0 * 0.0;
    auVar95._28_4_ = -fVar224;
    auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar86 = vmulps_avx512vl(auVar91,auVar90);
    auVar91 = vmulps_avx512vl(auVar88,auVar90);
    auVar89 = vmulps_avx512vl(auVar89,auVar90);
    auVar92 = vmulps_avx512vl(auVar95,auVar90);
    auVar93 = vmulps_avx512vl(local_600,auVar92);
    auVar96._4_4_ = local_620._4_4_ * auVar92._4_4_;
    auVar96._0_4_ = local_620._0_4_ * auVar92._0_4_;
    auVar96._8_4_ = local_620._8_4_ * auVar92._8_4_;
    auVar96._12_4_ = local_620._12_4_ * auVar92._12_4_;
    auVar96._16_4_ = local_620._16_4_ * auVar92._16_4_;
    auVar96._20_4_ = local_620._20_4_ * auVar92._20_4_;
    auVar96._24_4_ = local_620._24_4_ * auVar92._24_4_;
    auVar96._28_4_ = auVar88._28_4_;
    auVar88 = vmulps_avx512vl(local_560,auVar92);
    auVar97._4_4_ = local_640._4_4_ * auVar92._4_4_;
    auVar97._0_4_ = local_640._0_4_ * auVar92._0_4_;
    auVar97._8_4_ = local_640._8_4_ * auVar92._8_4_;
    auVar97._12_4_ = local_640._12_4_ * auVar92._12_4_;
    auVar97._16_4_ = local_640._16_4_ * auVar92._16_4_;
    auVar97._20_4_ = local_640._20_4_ * auVar92._20_4_;
    auVar97._24_4_ = local_640._24_4_ * auVar92._24_4_;
    auVar97._28_4_ = auVar92._28_4_;
    auVar92 = vfmadd231ps_avx512vl(auVar93,auVar89,auVar84);
    auVar93 = vfmadd231ps_avx512vl(auVar96,auVar89,auVar85);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar89,local_5c0);
    auVar89 = vfmadd231ps_avx512vl(auVar97,local_5e0,auVar89);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar91,auVar80);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar91,auVar81);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar91,auVar82);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar83,auVar91);
    auVar94 = vfmadd231ps_avx512vl(auVar92,auVar86,auVar76);
    auVar95 = vfmadd231ps_avx512vl(auVar93,auVar86,auVar77);
    auVar96 = vfmadd231ps_avx512vl(auVar88,auVar86,auVar78);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar79,auVar86);
    auVar98._4_4_ = (fVar226 + fVar226) * fVar221;
    auVar98._0_4_ = (fVar225 + fVar225) * fVar205;
    auVar98._8_4_ = (fVar244 + fVar244) * fVar222;
    auVar98._12_4_ = (fVar245 + fVar245) * fVar223;
    auVar98._16_4_ = (fVar246 + fVar246) * 0.0;
    auVar98._20_4_ = (fVar180 + fVar180) * 0.0;
    auVar98._24_4_ = (fVar247 + fVar247) * 0.0;
    auVar98._28_4_ = auVar91._28_4_;
    auVar86 = vsubps_avx(auVar98,auVar260._0_32_);
    auVar109._0_28_ =
         ZEXT1628(CONCAT412((fVar223 + fVar223) * (fVar259 + -5.0) + fVar259 * fVar223,
                            CONCAT48((fVar222 + fVar222) * (fVar258 + -5.0) + fVar258 * fVar222,
                                     CONCAT44((fVar221 + fVar221) * (fVar257 + -5.0) +
                                              fVar257 * fVar221,
                                              (fVar205 + fVar205) * (fVar253 + -5.0) +
                                              fVar253 * fVar205))));
    auVar109._28_4_ = auVar256._28_4_ + -5.0 + 0.0;
    auVar87 = vaddps_avx512vl(auVar252._0_32_,auVar87);
    auVar99._4_4_ = (fVar226 + fVar226) * auVar87._4_4_;
    auVar99._0_4_ = (fVar225 + fVar225) * auVar87._0_4_;
    auVar99._8_4_ = (fVar244 + fVar244) * auVar87._8_4_;
    auVar99._12_4_ = (fVar245 + fVar245) * auVar87._12_4_;
    auVar99._16_4_ = (fVar246 + fVar246) * auVar87._16_4_;
    auVar99._20_4_ = (fVar180 + fVar180) * auVar87._20_4_;
    auVar99._24_4_ = (fVar247 + fVar247) * auVar87._24_4_;
    auVar99._28_4_ = auVar87._28_4_;
    auVar100._4_4_ = fVar226 * 3.0 * fVar226;
    auVar100._0_4_ = fVar225 * 3.0 * fVar225;
    auVar100._8_4_ = fVar244 * 3.0 * fVar244;
    auVar100._12_4_ = fVar245 * 3.0 * fVar245;
    auVar100._16_4_ = fVar246 * 3.0 * fVar246;
    auVar100._20_4_ = fVar180 * 3.0 * fVar180;
    auVar100._24_4_ = fVar247 * 3.0 * fVar247;
    auVar100._28_4_ = fVar224;
    auVar87 = vsubps_avx(auVar99,auVar100);
    auVar88 = vsubps_avx(auVar159._0_32_,auVar98);
    auVar92 = vmulps_avx512vl(auVar86,auVar90);
    auVar93 = vmulps_avx512vl(auVar109,auVar90);
    auVar87 = vmulps_avx512vl(auVar87,auVar90);
    auVar88 = vmulps_avx512vl(auVar88,auVar90);
    auVar90 = vmulps_avx512vl(local_600,auVar88);
    auVar101._4_4_ = local_620._4_4_ * auVar88._4_4_;
    auVar101._0_4_ = local_620._0_4_ * auVar88._0_4_;
    auVar101._8_4_ = local_620._8_4_ * auVar88._8_4_;
    auVar101._12_4_ = local_620._12_4_ * auVar88._12_4_;
    auVar101._16_4_ = local_620._16_4_ * auVar88._16_4_;
    auVar101._20_4_ = local_620._20_4_ * auVar88._20_4_;
    auVar101._24_4_ = local_620._24_4_ * auVar88._24_4_;
    auVar101._28_4_ = auVar86._28_4_;
    auVar86 = vmulps_avx512vl(local_560,auVar88);
    auVar102._4_4_ = local_640._4_4_ * auVar88._4_4_;
    auVar102._0_4_ = local_640._0_4_ * auVar88._0_4_;
    auVar102._8_4_ = local_640._8_4_ * auVar88._8_4_;
    auVar102._12_4_ = local_640._12_4_ * auVar88._12_4_;
    auVar102._16_4_ = local_640._16_4_ * auVar88._16_4_;
    auVar102._20_4_ = local_640._20_4_ * auVar88._20_4_;
    auVar102._24_4_ = local_640._24_4_ * auVar88._24_4_;
    auVar102._28_4_ = auVar88._28_4_;
    auVar88 = vfmadd231ps_avx512vl(auVar90,auVar87,auVar84);
    auVar90 = vfmadd231ps_avx512vl(auVar101,auVar87,auVar85);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar87,local_5c0);
    auVar87 = vfmadd231ps_avx512vl(auVar102,local_5e0,auVar87);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar93,auVar80);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar93,auVar81);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar93,auVar82);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar83,auVar93);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar92,auVar76);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar92,auVar77);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar92,auVar78);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar79,auVar92);
    auVar117._4_4_ = auVar88._4_4_ * fVar227;
    auVar117._0_4_ = auVar88._0_4_ * fVar227;
    auVar117._8_4_ = auVar88._8_4_ * fVar227;
    auVar117._12_4_ = auVar88._12_4_ * fVar227;
    auVar117._16_4_ = auVar88._16_4_ * fVar227;
    auVar117._20_4_ = auVar88._20_4_ * fVar227;
    auVar117._24_4_ = auVar88._24_4_ * fVar227;
    auVar117._28_4_ = fVar224 + fVar224;
    auVar118._4_4_ = auVar90._4_4_ * fVar227;
    auVar118._0_4_ = auVar90._0_4_ * fVar227;
    auVar118._8_4_ = auVar90._8_4_ * fVar227;
    auVar118._12_4_ = auVar90._12_4_ * fVar227;
    auVar118._16_4_ = auVar90._16_4_ * fVar227;
    auVar118._20_4_ = auVar90._20_4_ * fVar227;
    auVar118._24_4_ = auVar90._24_4_ * fVar227;
    auVar118._28_4_ = auVar91._28_4_;
    auVar119._4_4_ = auVar86._4_4_ * fVar227;
    auVar119._0_4_ = auVar86._0_4_ * fVar227;
    auVar119._8_4_ = auVar86._8_4_ * fVar227;
    auVar119._12_4_ = auVar86._12_4_ * fVar227;
    auVar119._16_4_ = auVar86._16_4_ * fVar227;
    auVar119._20_4_ = auVar86._20_4_ * fVar227;
    auVar119._24_4_ = auVar86._24_4_ * fVar227;
    auVar119._28_4_ = 0;
    fVar205 = fVar227 * auVar87._0_4_;
    fVar221 = fVar227 * auVar87._4_4_;
    auVar106._4_4_ = fVar221;
    auVar106._0_4_ = fVar205;
    fVar222 = fVar227 * auVar87._8_4_;
    auVar106._8_4_ = fVar222;
    fVar223 = fVar227 * auVar87._12_4_;
    auVar106._12_4_ = fVar223;
    fVar224 = fVar227 * auVar87._16_4_;
    auVar106._16_4_ = fVar224;
    fVar225 = fVar227 * auVar87._20_4_;
    auVar106._20_4_ = fVar225;
    fVar226 = fVar227 * auVar87._24_4_;
    auVar106._24_4_ = fVar226;
    auVar106._28_4_ = fVar227;
    auVar67 = vxorps_avx512vl(auVar83._0_16_,auVar83._0_16_);
    auVar97 = vpermt2ps_avx512vl(auVar94,_DAT_01feed00,ZEXT1632(auVar67));
    auVar98 = vpermt2ps_avx512vl(auVar95,_DAT_01feed00,ZEXT1632(auVar67));
    auVar261 = ZEXT3264(auVar98);
    auVar88 = ZEXT1632(auVar67);
    auVar99 = vpermt2ps_avx512vl(auVar96,_DAT_01feed00,auVar88);
    auVar262 = ZEXT3264(auVar99);
    auVar110._0_4_ = auVar89._0_4_ + fVar205;
    auVar110._4_4_ = auVar89._4_4_ + fVar221;
    auVar110._8_4_ = auVar89._8_4_ + fVar222;
    auVar110._12_4_ = auVar89._12_4_ + fVar223;
    auVar110._16_4_ = auVar89._16_4_ + fVar224;
    auVar110._20_4_ = auVar89._20_4_ + fVar225;
    auVar110._24_4_ = auVar89._24_4_ + fVar226;
    auVar110._28_4_ = auVar89._28_4_ + fVar227;
    auVar86 = vmaxps_avx(auVar89,auVar110);
    auVar87 = vminps_avx(auVar89,auVar110);
    auVar92 = vpermt2ps_avx512vl(auVar89,_DAT_01feed00,auVar88);
    auVar100 = vpermt2ps_avx512vl(auVar117,_DAT_01feed00,auVar88);
    auVar256 = ZEXT3264(auVar100);
    auVar101 = vpermt2ps_avx512vl(auVar118,_DAT_01feed00,auVar88);
    auVar113 = ZEXT1632(auVar67);
    auVar102 = vpermt2ps_avx512vl(auVar119,_DAT_01feed00,auVar113);
    auVar88 = vpermt2ps_avx512vl(auVar106,_DAT_01feed00,auVar113);
    auVar93 = vsubps_avx512vl(auVar92,auVar88);
    auVar88 = vsubps_avx(auVar97,auVar94);
    auVar252 = ZEXT3264(auVar88);
    auVar89 = vsubps_avx(auVar98,auVar95);
    auVar91 = vsubps_avx(auVar99,auVar96);
    auVar90 = vmulps_avx512vl(auVar89,auVar119);
    auVar90 = vfmsub231ps_avx512vl(auVar90,auVar118,auVar91);
    auVar103 = vmulps_avx512vl(auVar91,auVar117);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar119,auVar88);
    auVar104 = vmulps_avx512vl(auVar88,auVar118);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar117,auVar89);
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar103);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar90,auVar90);
    auVar90 = vmulps_avx512vl(auVar91,auVar91);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar89,auVar89);
    auVar104 = vfmadd231ps_avx512vl(auVar90,auVar88,auVar88);
    auVar105 = vrcp14ps_avx512vl(auVar104);
    auVar90._8_4_ = 0x3f800000;
    auVar90._0_8_ = 0x3f8000003f800000;
    auVar90._12_4_ = 0x3f800000;
    auVar90._16_4_ = 0x3f800000;
    auVar90._20_4_ = 0x3f800000;
    auVar90._24_4_ = 0x3f800000;
    auVar90._28_4_ = 0x3f800000;
    auVar90 = vfnmadd213ps_avx512vl(auVar105,auVar104,auVar90);
    auVar90 = vfmadd132ps_avx512vl(auVar90,auVar105,auVar105);
    auVar103 = vmulps_avx512vl(auVar103,auVar90);
    auVar105 = vmulps_avx512vl(auVar89,auVar102);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar101,auVar91);
    auVar106 = vmulps_avx512vl(auVar91,auVar100);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar102,auVar88);
    auVar107 = vmulps_avx512vl(auVar88,auVar101);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar100,auVar89);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar90 = vmulps_avx512vl(auVar105,auVar90);
    auVar90 = vmaxps_avx512vl(auVar103,auVar90);
    auVar90 = vsqrtps_avx512vl(auVar90);
    auVar103 = vmaxps_avx512vl(auVar93,auVar92);
    auVar86 = vmaxps_avx512vl(auVar86,auVar103);
    auVar105 = vaddps_avx512vl(auVar90,auVar86);
    auVar86 = vminps_avx512vl(auVar93,auVar92);
    auVar86 = vminps_avx(auVar87,auVar86);
    auVar86 = vsubps_avx512vl(auVar86,auVar90);
    auVar92._8_4_ = 0x3f800002;
    auVar92._0_8_ = 0x3f8000023f800002;
    auVar92._12_4_ = 0x3f800002;
    auVar92._16_4_ = 0x3f800002;
    auVar92._20_4_ = 0x3f800002;
    auVar92._24_4_ = 0x3f800002;
    auVar92._28_4_ = 0x3f800002;
    auVar87 = vmulps_avx512vl(auVar105,auVar92);
    auVar93._8_4_ = 0x3f7ffffc;
    auVar93._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar93._12_4_ = 0x3f7ffffc;
    auVar93._16_4_ = 0x3f7ffffc;
    auVar93._20_4_ = 0x3f7ffffc;
    auVar93._24_4_ = 0x3f7ffffc;
    auVar93._28_4_ = 0x3f7ffffc;
    auVar86 = vmulps_avx512vl(auVar86,auVar93);
    auVar87 = vmulps_avx512vl(auVar87,auVar87);
    auVar90 = vrsqrt14ps_avx512vl(auVar104);
    auVar103._8_4_ = 0xbf000000;
    auVar103._0_8_ = 0xbf000000bf000000;
    auVar103._12_4_ = 0xbf000000;
    auVar103._16_4_ = 0xbf000000;
    auVar103._20_4_ = 0xbf000000;
    auVar103._24_4_ = 0xbf000000;
    auVar103._28_4_ = 0xbf000000;
    auVar92 = vmulps_avx512vl(auVar104,auVar103);
    fVar227 = auVar90._0_4_;
    fVar205 = auVar90._4_4_;
    fVar221 = auVar90._8_4_;
    fVar222 = auVar90._12_4_;
    fVar223 = auVar90._16_4_;
    fVar224 = auVar90._20_4_;
    fVar225 = auVar90._24_4_;
    auVar107._4_4_ = fVar205 * fVar205 * fVar205 * auVar92._4_4_;
    auVar107._0_4_ = fVar227 * fVar227 * fVar227 * auVar92._0_4_;
    auVar107._8_4_ = fVar221 * fVar221 * fVar221 * auVar92._8_4_;
    auVar107._12_4_ = fVar222 * fVar222 * fVar222 * auVar92._12_4_;
    auVar107._16_4_ = fVar223 * fVar223 * fVar223 * auVar92._16_4_;
    auVar107._20_4_ = fVar224 * fVar224 * fVar224 * auVar92._20_4_;
    auVar107._24_4_ = fVar225 * fVar225 * fVar225 * auVar92._24_4_;
    auVar107._28_4_ = auVar105._28_4_;
    auVar104._8_4_ = 0x3fc00000;
    auVar104._0_8_ = 0x3fc000003fc00000;
    auVar104._12_4_ = 0x3fc00000;
    auVar104._16_4_ = 0x3fc00000;
    auVar104._20_4_ = 0x3fc00000;
    auVar104._24_4_ = 0x3fc00000;
    auVar104._28_4_ = 0x3fc00000;
    auVar90 = vfmadd231ps_avx512vl(auVar107,auVar90,auVar104);
    auVar92 = vmulps_avx512vl(auVar88,auVar90);
    auVar93 = vmulps_avx512vl(auVar89,auVar90);
    auVar103 = vmulps_avx512vl(auVar91,auVar90);
    auVar104 = vsubps_avx512vl(auVar113,auVar94);
    auVar106 = vsubps_avx512vl(auVar113,auVar95);
    auVar107 = vsubps_avx512vl(auVar113,auVar96);
    auVar105 = vmulps_avx512vl(local_860,auVar107);
    auVar105 = vfmadd231ps_avx512vl(auVar105,local_840,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar105,_local_820,auVar104);
    auVar108 = vmulps_avx512vl(auVar107,auVar107);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar106,auVar106);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar104,auVar104);
    auVar109 = vmulps_avx512vl(local_860,auVar103);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar93,local_840);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar92,_local_820);
    auVar103 = vmulps_avx512vl(auVar107,auVar103);
    auVar93 = vfmadd231ps_avx512vl(auVar103,auVar106,auVar93);
    auVar92 = vfmadd231ps_avx512vl(auVar93,auVar104,auVar92);
    auVar93 = vmulps_avx512vl(auVar109,auVar109);
    auVar103 = vsubps_avx512vl(local_580,auVar93);
    auVar110 = vmulps_avx512vl(auVar109,auVar92);
    auVar105 = vsubps_avx512vl(auVar105,auVar110);
    auVar110 = vaddps_avx512vl(auVar105,auVar105);
    auVar105 = vmulps_avx512vl(auVar92,auVar92);
    auVar108 = vsubps_avx512vl(auVar108,auVar105);
    auVar87 = vsubps_avx512vl(auVar108,auVar87);
    auVar111 = vmulps_avx512vl(auVar110,auVar110);
    auVar105._8_4_ = 0x40800000;
    auVar105._0_8_ = 0x4080000040800000;
    auVar105._12_4_ = 0x40800000;
    auVar105._16_4_ = 0x40800000;
    auVar105._20_4_ = 0x40800000;
    auVar105._24_4_ = 0x40800000;
    auVar105._28_4_ = 0x40800000;
    _local_880 = vmulps_avx512vl(auVar103,auVar105);
    auVar105 = vmulps_avx512vl(_local_880,auVar87);
    auVar105 = vsubps_avx512vl(auVar111,auVar105);
    uVar60 = vcmpps_avx512vl(auVar105,auVar113,5);
    bVar47 = (byte)uVar60;
    if (bVar47 != 0) {
      local_800._0_32_ = auVar108;
      auVar105 = vsqrtps_avx512vl(auVar105);
      auVar112 = vaddps_avx512vl(auVar103,auVar103);
      local_8a0 = vrcp14ps_avx512vl(auVar112);
      auVar113._8_4_ = 0x3f800000;
      auVar113._0_8_ = 0x3f8000003f800000;
      auVar113._12_4_ = 0x3f800000;
      auVar113._16_4_ = 0x3f800000;
      auVar113._20_4_ = 0x3f800000;
      auVar113._24_4_ = 0x3f800000;
      auVar113._28_4_ = 0x3f800000;
      auVar113 = vfnmadd213ps_avx512vl(local_8a0,auVar112,auVar113);
      auVar113 = vfmadd132ps_avx512vl(auVar113,local_8a0,local_8a0);
      auVar114._8_4_ = 0x80000000;
      auVar114._0_8_ = 0x8000000080000000;
      auVar114._12_4_ = 0x80000000;
      auVar114._16_4_ = 0x80000000;
      auVar114._20_4_ = 0x80000000;
      auVar114._24_4_ = 0x80000000;
      auVar114._28_4_ = 0x80000000;
      local_8c0 = vxorps_avx512vl(auVar110,auVar114);
      auVar114 = vsubps_avx512vl(local_8c0,auVar105);
      auVar114 = vmulps_avx512vl(auVar114,auVar113);
      auVar105 = vsubps_avx512vl(auVar105,auVar110);
      local_8e0 = vmulps_avx512vl(auVar105,auVar113);
      auVar105 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar113 = vblendmps_avx512vl(auVar105,auVar114);
      auVar115._0_4_ =
           (uint)(bVar47 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar47 & 1) * auVar105._0_4_;
      bVar59 = (bool)((byte)(uVar60 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar59 * auVar113._4_4_ | (uint)!bVar59 * auVar105._4_4_;
      bVar59 = (bool)((byte)(uVar60 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar59 * auVar113._8_4_ | (uint)!bVar59 * auVar105._8_4_;
      bVar59 = (bool)((byte)(uVar60 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar59 * auVar113._12_4_ | (uint)!bVar59 * auVar105._12_4_;
      bVar59 = (bool)((byte)(uVar60 >> 4) & 1);
      auVar115._16_4_ = (uint)bVar59 * auVar113._16_4_ | (uint)!bVar59 * auVar105._16_4_;
      bVar59 = (bool)((byte)(uVar60 >> 5) & 1);
      auVar115._20_4_ = (uint)bVar59 * auVar113._20_4_ | (uint)!bVar59 * auVar105._20_4_;
      bVar59 = (bool)((byte)(uVar60 >> 6) & 1);
      auVar115._24_4_ = (uint)bVar59 * auVar113._24_4_ | (uint)!bVar59 * auVar105._24_4_;
      bVar59 = SUB81(uVar60 >> 7,0);
      auVar115._28_4_ = (uint)bVar59 * auVar113._28_4_ | (uint)!bVar59 * auVar105._28_4_;
      auVar105 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar113 = vblendmps_avx512vl(auVar105,local_8e0);
      auVar116._0_4_ =
           (uint)(bVar47 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar47 & 1) * auVar105._0_4_;
      bVar59 = (bool)((byte)(uVar60 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar59 * auVar113._4_4_ | (uint)!bVar59 * auVar105._4_4_;
      bVar59 = (bool)((byte)(uVar60 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar59 * auVar113._8_4_ | (uint)!bVar59 * auVar105._8_4_;
      bVar59 = (bool)((byte)(uVar60 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar59 * auVar113._12_4_ | (uint)!bVar59 * auVar105._12_4_;
      bVar59 = (bool)((byte)(uVar60 >> 4) & 1);
      auVar116._16_4_ = (uint)bVar59 * auVar113._16_4_ | (uint)!bVar59 * auVar105._16_4_;
      bVar59 = (bool)((byte)(uVar60 >> 5) & 1);
      auVar116._20_4_ = (uint)bVar59 * auVar113._20_4_ | (uint)!bVar59 * auVar105._20_4_;
      bVar59 = (bool)((byte)(uVar60 >> 6) & 1);
      auVar116._24_4_ = (uint)bVar59 * auVar113._24_4_ | (uint)!bVar59 * auVar105._24_4_;
      bVar59 = SUB81(uVar60 >> 7,0);
      auVar116._28_4_ = (uint)bVar59 * auVar113._28_4_ | (uint)!bVar59 * auVar105._28_4_;
      auVar105 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar93,auVar105);
      local_a00 = vmaxps_avx512vl(local_5a0,auVar105);
      auVar220._8_4_ = 0x36000000;
      auVar220._0_8_ = 0x3600000036000000;
      auVar220._12_4_ = 0x36000000;
      auVar220._16_4_ = 0x36000000;
      auVar220._20_4_ = 0x36000000;
      auVar220._24_4_ = 0x36000000;
      auVar220._28_4_ = 0x36000000;
      local_a20 = vmulps_avx512vl(local_a00,auVar220);
      vandps_avx512vl(auVar103,auVar105);
      uVar50 = vcmpps_avx512vl(local_a20,local_a20,1);
      uVar60 = uVar60 & uVar50;
      bVar54 = (byte)uVar60;
      if (bVar54 != 0) {
        uVar50 = vcmpps_avx512vl(auVar87,_DAT_01faff00,2);
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar103 = vblendmps_avx512vl(auVar87,auVar93);
        bVar51 = (byte)uVar50;
        uVar62 = (uint)(bVar51 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar51 & 1) * local_a20._0_4_;
        bVar59 = (bool)((byte)(uVar50 >> 1) & 1);
        uVar61 = (uint)bVar59 * auVar103._4_4_ | (uint)!bVar59 * local_a20._4_4_;
        bVar59 = (bool)((byte)(uVar50 >> 2) & 1);
        uVar135 = (uint)bVar59 * auVar103._8_4_ | (uint)!bVar59 * local_a20._8_4_;
        bVar59 = (bool)((byte)(uVar50 >> 3) & 1);
        uVar136 = (uint)bVar59 * auVar103._12_4_ | (uint)!bVar59 * local_a20._12_4_;
        bVar59 = (bool)((byte)(uVar50 >> 4) & 1);
        uVar137 = (uint)bVar59 * auVar103._16_4_ | (uint)!bVar59 * local_a20._16_4_;
        bVar59 = (bool)((byte)(uVar50 >> 5) & 1);
        uVar138 = (uint)bVar59 * auVar103._20_4_ | (uint)!bVar59 * local_a20._20_4_;
        bVar59 = (bool)((byte)(uVar50 >> 6) & 1);
        uVar139 = (uint)bVar59 * auVar103._24_4_ | (uint)!bVar59 * local_a20._24_4_;
        bVar59 = SUB81(uVar50 >> 7,0);
        uVar140 = (uint)bVar59 * auVar103._28_4_ | (uint)!bVar59 * local_a20._28_4_;
        auVar115._0_4_ = (bVar54 & 1) * uVar62 | !(bool)(bVar54 & 1) * auVar115._0_4_;
        bVar59 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar115._4_4_ = bVar59 * uVar61 | !bVar59 * auVar115._4_4_;
        bVar59 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar115._8_4_ = bVar59 * uVar135 | !bVar59 * auVar115._8_4_;
        bVar59 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar115._12_4_ = bVar59 * uVar136 | !bVar59 * auVar115._12_4_;
        bVar59 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar115._16_4_ = bVar59 * uVar137 | !bVar59 * auVar115._16_4_;
        bVar59 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar115._20_4_ = bVar59 * uVar138 | !bVar59 * auVar115._20_4_;
        bVar59 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar115._24_4_ = bVar59 * uVar139 | !bVar59 * auVar115._24_4_;
        bVar59 = SUB81(uVar60 >> 7,0);
        auVar115._28_4_ = bVar59 * uVar140 | !bVar59 * auVar115._28_4_;
        auVar87 = vblendmps_avx512vl(auVar93,auVar87);
        bVar59 = (bool)((byte)(uVar50 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar50 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar50 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar50 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar50 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar50 >> 6) & 1);
        bVar10 = SUB81(uVar50 >> 7,0);
        auVar116._0_4_ =
             (uint)(bVar54 & 1) *
             ((uint)(bVar51 & 1) * auVar87._0_4_ | !(bool)(bVar51 & 1) * uVar62) |
             !(bool)(bVar54 & 1) * auVar116._0_4_;
        bVar4 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar116._4_4_ =
             (uint)bVar4 * ((uint)bVar59 * auVar87._4_4_ | !bVar59 * uVar61) |
             !bVar4 * auVar116._4_4_;
        bVar59 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar116._8_4_ =
             (uint)bVar59 * ((uint)bVar5 * auVar87._8_4_ | !bVar5 * uVar135) |
             !bVar59 * auVar116._8_4_;
        bVar59 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar116._12_4_ =
             (uint)bVar59 * ((uint)bVar6 * auVar87._12_4_ | !bVar6 * uVar136) |
             !bVar59 * auVar116._12_4_;
        bVar59 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar116._16_4_ =
             (uint)bVar59 * ((uint)bVar7 * auVar87._16_4_ | !bVar7 * uVar137) |
             !bVar59 * auVar116._16_4_;
        bVar59 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar116._20_4_ =
             (uint)bVar59 * ((uint)bVar8 * auVar87._20_4_ | !bVar8 * uVar138) |
             !bVar59 * auVar116._20_4_;
        bVar59 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar116._24_4_ =
             (uint)bVar59 * ((uint)bVar9 * auVar87._24_4_ | !bVar9 * uVar139) |
             !bVar59 * auVar116._24_4_;
        bVar59 = SUB81(uVar60 >> 7,0);
        auVar116._28_4_ =
             (uint)bVar59 * ((uint)bVar10 * auVar87._28_4_ | !bVar10 * uVar140) |
             !bVar59 * auVar116._28_4_;
        bVar47 = (~bVar54 | bVar51) & bVar47;
      }
      if ((bVar47 & 0x7f) != 0) {
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar93 = vxorps_avx512vl(auVar102,auVar87);
        auVar103 = vxorps_avx512vl(auVar100,auVar87);
        uVar62 = *(uint *)(ray + k * 4 + 0x200);
        auVar105 = vxorps_avx512vl(auVar101,auVar87);
        auVar67 = vsubss_avx512f(ZEXT416(uVar62),ZEXT416((uint)local_930._0_4_));
        auVar100 = vbroadcastss_avx512vl(auVar67);
        auVar100 = vminps_avx512vl(auVar100,auVar116);
        auVar46._4_4_ = fStack_65c;
        auVar46._0_4_ = local_660;
        auVar46._8_4_ = fStack_658;
        auVar46._12_4_ = fStack_654;
        auVar46._16_4_ = fStack_650;
        auVar46._20_4_ = fStack_64c;
        auVar46._24_4_ = fStack_648;
        auVar46._28_4_ = fStack_644;
        auVar101 = vmaxps_avx512vl(auVar46,auVar115);
        auVar102 = vmulps_avx512vl(auVar107,auVar119);
        auVar102 = vfmadd213ps_avx512vl(auVar106,auVar118,auVar102);
        auVar67 = vfmadd213ps_fma(auVar104,auVar117,auVar102);
        auVar104 = vmulps_avx512vl(local_860,auVar119);
        auVar104 = vfmadd231ps_avx512vl(auVar104,local_840,auVar118);
        auVar69 = vfmadd231ps_fma(auVar104,_local_820,auVar117);
        auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(ZEXT1632(auVar69),auVar104);
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar12 = vcmpps_avx512vl(auVar104,auVar102,1);
        auVar117 = vxorps_avx512vl(ZEXT1632(auVar67),auVar87);
        auVar118 = vrcp14ps_avx512vl(ZEXT1632(auVar69));
        auVar220 = ZEXT1632(auVar69);
        auVar119 = vxorps_avx512vl(auVar220,auVar87);
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar107 = vfnmadd213ps_avx512vl(auVar118,auVar220,auVar106);
        auVar67 = vfmadd132ps_fma(auVar107,auVar118,auVar118);
        fVar227 = auVar67._0_4_ * auVar117._0_4_;
        fVar205 = auVar67._4_4_ * auVar117._4_4_;
        auVar30._4_4_ = fVar205;
        auVar30._0_4_ = fVar227;
        fVar221 = auVar67._8_4_ * auVar117._8_4_;
        auVar30._8_4_ = fVar221;
        fVar222 = auVar67._12_4_ * auVar117._12_4_;
        auVar30._12_4_ = fVar222;
        fVar223 = auVar117._16_4_ * 0.0;
        auVar30._16_4_ = fVar223;
        fVar224 = auVar117._20_4_ * 0.0;
        auVar30._20_4_ = fVar224;
        fVar225 = auVar117._24_4_ * 0.0;
        auVar30._24_4_ = fVar225;
        auVar30._28_4_ = auVar117._28_4_;
        uVar13 = vcmpps_avx512vl(auVar220,auVar119,1);
        bVar54 = (byte)uVar12 | (byte)uVar13;
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar113 = vblendmps_avx512vl(auVar30,auVar107);
        auVar120._0_4_ =
             (uint)(bVar54 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar118._0_4_;
        bVar59 = (bool)(bVar54 >> 1 & 1);
        auVar120._4_4_ = (uint)bVar59 * auVar113._4_4_ | (uint)!bVar59 * auVar118._4_4_;
        bVar59 = (bool)(bVar54 >> 2 & 1);
        auVar120._8_4_ = (uint)bVar59 * auVar113._8_4_ | (uint)!bVar59 * auVar118._8_4_;
        bVar59 = (bool)(bVar54 >> 3 & 1);
        auVar120._12_4_ = (uint)bVar59 * auVar113._12_4_ | (uint)!bVar59 * auVar118._12_4_;
        bVar59 = (bool)(bVar54 >> 4 & 1);
        auVar120._16_4_ = (uint)bVar59 * auVar113._16_4_ | (uint)!bVar59 * auVar118._16_4_;
        bVar59 = (bool)(bVar54 >> 5 & 1);
        auVar120._20_4_ = (uint)bVar59 * auVar113._20_4_ | (uint)!bVar59 * auVar118._20_4_;
        bVar59 = (bool)(bVar54 >> 6 & 1);
        auVar120._24_4_ = (uint)bVar59 * auVar113._24_4_ | (uint)!bVar59 * auVar118._24_4_;
        auVar120._28_4_ =
             (uint)(bVar54 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar54 >> 7) * auVar118._28_4_;
        auVar118 = vmaxps_avx512vl(auVar101,auVar120);
        uVar13 = vcmpps_avx512vl(auVar220,auVar119,6);
        bVar54 = (byte)uVar12 | (byte)uVar13;
        auVar121._0_4_ = (uint)(bVar54 & 1) * 0x7f800000 | (uint)!(bool)(bVar54 & 1) * (int)fVar227;
        bVar59 = (bool)(bVar54 >> 1 & 1);
        auVar121._4_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar205;
        bVar59 = (bool)(bVar54 >> 2 & 1);
        auVar121._8_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar221;
        bVar59 = (bool)(bVar54 >> 3 & 1);
        auVar121._12_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar222;
        bVar59 = (bool)(bVar54 >> 4 & 1);
        auVar121._16_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar223;
        bVar59 = (bool)(bVar54 >> 5 & 1);
        auVar121._20_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar224;
        bVar59 = (bool)(bVar54 >> 6 & 1);
        auVar121._24_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar225;
        auVar121._28_4_ =
             (uint)(bVar54 >> 7) * 0x7f800000 | (uint)!(bool)(bVar54 >> 7) * auVar117._28_4_;
        auVar117 = vminps_avx512vl(auVar100,auVar121);
        auVar67 = vxorps_avx512vl(auVar101._0_16_,auVar101._0_16_);
        auVar97 = vsubps_avx512vl(ZEXT1632(auVar67),auVar97);
        auVar98 = vsubps_avx512vl(ZEXT1632(auVar67),auVar98);
        auVar101 = ZEXT1632(auVar67);
        auVar99 = vsubps_avx512vl(auVar101,auVar99);
        auVar99 = vmulps_avx512vl(auVar99,auVar93);
        auVar98 = vfmadd231ps_avx512vl(auVar99,auVar105,auVar98);
        auVar97 = vfmadd231ps_avx512vl(auVar98,auVar103,auVar97);
        auVar93 = vmulps_avx512vl(local_860,auVar93);
        auVar93 = vfmadd231ps_avx512vl(auVar93,local_840,auVar105);
        auVar93 = vfmadd231ps_avx512vl(auVar93,_local_820,auVar103);
        vandps_avx512vl(auVar93,auVar104);
        uVar12 = vcmpps_avx512vl(auVar93,auVar102,1);
        auVar103 = vxorps_avx512vl(auVar97,auVar87);
        auVar104 = vrcp14ps_avx512vl(auVar93);
        auVar87 = vxorps_avx512vl(auVar93,auVar87);
        auVar262 = ZEXT3264(auVar87);
        auVar105 = vfnmadd213ps_avx512vl(auVar104,auVar93,auVar106);
        auVar67 = vfmadd132ps_fma(auVar105,auVar104,auVar104);
        fVar227 = auVar67._0_4_ * auVar103._0_4_;
        fVar205 = auVar67._4_4_ * auVar103._4_4_;
        auVar31._4_4_ = fVar205;
        auVar31._0_4_ = fVar227;
        fVar221 = auVar67._8_4_ * auVar103._8_4_;
        auVar31._8_4_ = fVar221;
        fVar222 = auVar67._12_4_ * auVar103._12_4_;
        auVar31._12_4_ = fVar222;
        fVar223 = auVar103._16_4_ * 0.0;
        auVar31._16_4_ = fVar223;
        fVar224 = auVar103._20_4_ * 0.0;
        auVar31._20_4_ = fVar224;
        fVar225 = auVar103._24_4_ * 0.0;
        auVar31._24_4_ = fVar225;
        auVar31._28_4_ = auVar103._28_4_;
        uVar13 = vcmpps_avx512vl(auVar93,auVar87,1);
        bVar54 = (byte)uVar12 | (byte)uVar13;
        auVar105 = vblendmps_avx512vl(auVar31,auVar107);
        auVar122._0_4_ =
             (uint)(bVar54 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar104._0_4_;
        bVar59 = (bool)(bVar54 >> 1 & 1);
        auVar122._4_4_ = (uint)bVar59 * auVar105._4_4_ | (uint)!bVar59 * auVar104._4_4_;
        bVar59 = (bool)(bVar54 >> 2 & 1);
        auVar122._8_4_ = (uint)bVar59 * auVar105._8_4_ | (uint)!bVar59 * auVar104._8_4_;
        bVar59 = (bool)(bVar54 >> 3 & 1);
        auVar122._12_4_ = (uint)bVar59 * auVar105._12_4_ | (uint)!bVar59 * auVar104._12_4_;
        bVar59 = (bool)(bVar54 >> 4 & 1);
        auVar122._16_4_ = (uint)bVar59 * auVar105._16_4_ | (uint)!bVar59 * auVar104._16_4_;
        bVar59 = (bool)(bVar54 >> 5 & 1);
        auVar122._20_4_ = (uint)bVar59 * auVar105._20_4_ | (uint)!bVar59 * auVar104._20_4_;
        bVar59 = (bool)(bVar54 >> 6 & 1);
        auVar122._24_4_ = (uint)bVar59 * auVar105._24_4_ | (uint)!bVar59 * auVar104._24_4_;
        auVar122._28_4_ =
             (uint)(bVar54 >> 7) * auVar105._28_4_ | (uint)!(bool)(bVar54 >> 7) * auVar104._28_4_;
        auVar261 = ZEXT3264(auVar122);
        _local_a40 = vmaxps_avx(auVar118,auVar122);
        auVar256 = ZEXT3264(_local_a40);
        uVar13 = vcmpps_avx512vl(auVar93,auVar87,6);
        bVar54 = (byte)uVar12 | (byte)uVar13;
        auVar123._0_4_ = (uint)(bVar54 & 1) * 0x7f800000 | (uint)!(bool)(bVar54 & 1) * (int)fVar227;
        bVar59 = (bool)(bVar54 >> 1 & 1);
        auVar123._4_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar205;
        bVar59 = (bool)(bVar54 >> 2 & 1);
        auVar123._8_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar221;
        bVar59 = (bool)(bVar54 >> 3 & 1);
        auVar123._12_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar222;
        bVar59 = (bool)(bVar54 >> 4 & 1);
        auVar123._16_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar223;
        bVar59 = (bool)(bVar54 >> 5 & 1);
        auVar123._20_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar224;
        bVar59 = (bool)(bVar54 >> 6 & 1);
        auVar123._24_4_ = (uint)bVar59 * 0x7f800000 | (uint)!bVar59 * (int)fVar225;
        auVar123._28_4_ =
             (uint)(bVar54 >> 7) * 0x7f800000 | (uint)!(bool)(bVar54 >> 7) * auVar103._28_4_;
        local_6c0 = vminps_avx(auVar117,auVar123);
        uVar12 = vcmpps_avx512vl(_local_a40,local_6c0,2);
        bVar47 = bVar47 & 0x7f & (byte)uVar12;
        if (bVar47 != 0) {
          auVar87 = vmaxps_avx512vl(auVar101,auVar86);
          auVar86 = vfmadd213ps_avx512vl(auVar114,auVar109,auVar92);
          fVar227 = auVar90._0_4_;
          fVar205 = auVar90._4_4_;
          auVar32._4_4_ = fVar205 * auVar86._4_4_;
          auVar32._0_4_ = fVar227 * auVar86._0_4_;
          fVar221 = auVar90._8_4_;
          auVar32._8_4_ = fVar221 * auVar86._8_4_;
          fVar222 = auVar90._12_4_;
          auVar32._12_4_ = fVar222 * auVar86._12_4_;
          fVar223 = auVar90._16_4_;
          auVar32._16_4_ = fVar223 * auVar86._16_4_;
          fVar224 = auVar90._20_4_;
          auVar32._20_4_ = fVar224 * auVar86._20_4_;
          fVar225 = auVar90._24_4_;
          auVar32._24_4_ = fVar225 * auVar86._24_4_;
          auVar32._28_4_ = auVar86._28_4_;
          auVar86 = vfmadd213ps_avx512vl(local_8e0,auVar109,auVar92);
          auVar33._4_4_ = fVar205 * auVar86._4_4_;
          auVar33._0_4_ = fVar227 * auVar86._0_4_;
          auVar33._8_4_ = fVar221 * auVar86._8_4_;
          auVar33._12_4_ = fVar222 * auVar86._12_4_;
          auVar33._16_4_ = fVar223 * auVar86._16_4_;
          auVar33._20_4_ = fVar224 * auVar86._20_4_;
          auVar33._24_4_ = fVar225 * auVar86._24_4_;
          auVar33._28_4_ = auVar122._28_4_;
          auVar86 = vminps_avx512vl(auVar32,auVar106);
          auVar93 = ZEXT832(0) << 0x20;
          auVar86 = vmaxps_avx(auVar86,ZEXT832(0) << 0x20);
          auVar103 = vminps_avx512vl(auVar33,auVar106);
          auVar34._4_4_ = (auVar86._4_4_ + 1.0) * 0.125;
          auVar34._0_4_ = (auVar86._0_4_ + 0.0) * 0.125;
          auVar34._8_4_ = (auVar86._8_4_ + 2.0) * 0.125;
          auVar34._12_4_ = (auVar86._12_4_ + 3.0) * 0.125;
          auVar34._16_4_ = (auVar86._16_4_ + 4.0) * 0.125;
          auVar34._20_4_ = (auVar86._20_4_ + 5.0) * 0.125;
          auVar34._24_4_ = (auVar86._24_4_ + 6.0) * 0.125;
          auVar34._28_4_ = auVar86._28_4_ + 7.0;
          auVar67 = vfmadd213ps_fma(auVar34,auVar152,auVar232);
          local_520 = ZEXT1632(auVar67);
          auVar86 = vmaxps_avx(auVar103,ZEXT832(0) << 0x20);
          auVar35._4_4_ = (auVar86._4_4_ + 1.0) * 0.125;
          auVar35._0_4_ = (auVar86._0_4_ + 0.0) * 0.125;
          auVar35._8_4_ = (auVar86._8_4_ + 2.0) * 0.125;
          auVar35._12_4_ = (auVar86._12_4_ + 3.0) * 0.125;
          auVar35._16_4_ = (auVar86._16_4_ + 4.0) * 0.125;
          auVar35._20_4_ = (auVar86._20_4_ + 5.0) * 0.125;
          auVar35._24_4_ = (auVar86._24_4_ + 6.0) * 0.125;
          auVar35._28_4_ = auVar86._28_4_ + 7.0;
          auVar67 = vfmadd213ps_fma(auVar35,auVar152,auVar232);
          local_540 = ZEXT1632(auVar67);
          auVar36._4_4_ = auVar87._4_4_ * auVar87._4_4_;
          auVar36._0_4_ = auVar87._0_4_ * auVar87._0_4_;
          auVar36._8_4_ = auVar87._8_4_ * auVar87._8_4_;
          auVar36._12_4_ = auVar87._12_4_ * auVar87._12_4_;
          auVar36._16_4_ = auVar87._16_4_ * auVar87._16_4_;
          auVar36._20_4_ = auVar87._20_4_ * auVar87._20_4_;
          auVar36._24_4_ = auVar87._24_4_ * auVar87._24_4_;
          auVar36._28_4_ = auVar87._28_4_;
          auVar86 = vsubps_avx(auVar108,auVar36);
          auVar37._4_4_ = auVar86._4_4_ * (float)local_880._4_4_;
          auVar37._0_4_ = auVar86._0_4_ * (float)local_880._0_4_;
          auVar37._8_4_ = auVar86._8_4_ * fStack_878;
          auVar37._12_4_ = auVar86._12_4_ * fStack_874;
          auVar37._16_4_ = auVar86._16_4_ * fStack_870;
          auVar37._20_4_ = auVar86._20_4_ * fStack_86c;
          auVar37._24_4_ = auVar86._24_4_ * fStack_868;
          auVar37._28_4_ = auVar87._28_4_;
          auVar87 = vsubps_avx(auVar111,auVar37);
          uVar12 = vcmpps_avx512vl(auVar87,ZEXT832(0) << 0x20,5);
          bVar54 = (byte)uVar12;
          if (bVar54 == 0) {
            bVar54 = 0;
            auVar88 = ZEXT832(0) << 0x20;
            auVar159 = ZEXT864(0) << 0x20;
            auVar87 = SUB6432(ZEXT864(0),0) << 0x20;
            auVar103 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar261 = ZEXT864(0) << 0x20;
            auVar111._8_4_ = 0x7f800000;
            auVar111._0_8_ = 0x7f8000007f800000;
            auVar111._12_4_ = 0x7f800000;
            auVar111._16_4_ = 0x7f800000;
            auVar111._20_4_ = 0x7f800000;
            auVar111._24_4_ = 0x7f800000;
            auVar111._28_4_ = 0x7f800000;
            auVar112._8_4_ = 0xff800000;
            auVar112._0_8_ = 0xff800000ff800000;
            auVar112._12_4_ = 0xff800000;
            auVar112._16_4_ = 0xff800000;
            auVar112._20_4_ = 0xff800000;
            auVar112._24_4_ = 0xff800000;
            auVar112._28_4_ = 0xff800000;
          }
          else {
            auVar69 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
            uVar60 = vcmpps_avx512vl(auVar87,auVar101,5);
            auVar87 = vsqrtps_avx(auVar87);
            auVar93 = vfnmadd213ps_avx512vl(auVar112,local_8a0,auVar106);
            auVar104 = vfmadd132ps_avx512vl(auVar93,local_8a0,local_8a0);
            auVar93 = vsubps_avx(local_8c0,auVar87);
            auVar105 = vmulps_avx512vl(auVar93,auVar104);
            auVar87 = vsubps_avx512vl(auVar87,auVar110);
            auVar104 = vmulps_avx512vl(auVar87,auVar104);
            auVar87 = vfmadd213ps_avx512vl(auVar109,auVar105,auVar92);
            auVar38._4_4_ = fVar205 * auVar87._4_4_;
            auVar38._0_4_ = fVar227 * auVar87._0_4_;
            auVar38._8_4_ = fVar221 * auVar87._8_4_;
            auVar38._12_4_ = fVar222 * auVar87._12_4_;
            auVar38._16_4_ = fVar223 * auVar87._16_4_;
            auVar38._20_4_ = fVar224 * auVar87._20_4_;
            auVar38._24_4_ = fVar225 * auVar87._24_4_;
            auVar38._28_4_ = auVar103._28_4_;
            auVar39._4_4_ = (float)local_820._4_4_ * auVar105._4_4_;
            auVar39._0_4_ = (float)local_820._0_4_ * auVar105._0_4_;
            auVar39._8_4_ = fStack_818 * auVar105._8_4_;
            auVar39._12_4_ = fStack_814 * auVar105._12_4_;
            auVar39._16_4_ = fStack_810 * auVar105._16_4_;
            auVar39._20_4_ = fStack_80c * auVar105._20_4_;
            auVar39._24_4_ = fStack_808 * auVar105._24_4_;
            auVar39._28_4_ = auVar87._28_4_;
            auVar93 = vmulps_avx512vl(local_840,auVar105);
            auVar97 = vmulps_avx512vl(local_860,auVar105);
            auVar87 = vfmadd213ps_avx512vl(auVar88,auVar38,auVar94);
            auVar87 = vsubps_avx512vl(auVar39,auVar87);
            auVar103 = vfmadd213ps_avx512vl(auVar89,auVar38,auVar95);
            auVar103 = vsubps_avx512vl(auVar93,auVar103);
            auVar67 = vfmadd213ps_fma(auVar38,auVar91,auVar96);
            auVar93 = vsubps_avx(auVar97,ZEXT1632(auVar67));
            auVar261 = ZEXT3264(auVar93);
            auVar92 = vfmadd213ps_avx512vl(auVar109,auVar104,auVar92);
            auVar90 = vmulps_avx512vl(auVar90,auVar92);
            auVar40._4_4_ = (float)local_820._4_4_ * auVar104._4_4_;
            auVar40._0_4_ = (float)local_820._0_4_ * auVar104._0_4_;
            auVar40._8_4_ = fStack_818 * auVar104._8_4_;
            auVar40._12_4_ = fStack_814 * auVar104._12_4_;
            auVar40._16_4_ = fStack_810 * auVar104._16_4_;
            auVar40._20_4_ = fStack_80c * auVar104._20_4_;
            auVar40._24_4_ = fStack_808 * auVar104._24_4_;
            auVar40._28_4_ = auVar97._28_4_;
            auVar92 = vmulps_avx512vl(local_840,auVar104);
            auVar97 = vmulps_avx512vl(local_860,auVar104);
            auVar67 = vfmadd213ps_fma(auVar88,auVar90,auVar94);
            auVar93 = vsubps_avx(auVar40,ZEXT1632(auVar67));
            auVar67 = vfmadd213ps_fma(auVar89,auVar90,auVar95);
            auVar88 = vsubps_avx512vl(auVar92,ZEXT1632(auVar67));
            auVar67 = vfmadd213ps_fma(auVar91,auVar90,auVar96);
            auVar89 = vsubps_avx512vl(auVar97,ZEXT1632(auVar67));
            auVar159 = ZEXT3264(auVar89);
            auVar153._8_4_ = 0x7f800000;
            auVar153._0_8_ = 0x7f8000007f800000;
            auVar153._12_4_ = 0x7f800000;
            auVar153._16_4_ = 0x7f800000;
            auVar153._20_4_ = 0x7f800000;
            auVar153._24_4_ = 0x7f800000;
            auVar153._28_4_ = 0x7f800000;
            auVar89 = vblendmps_avx512vl(auVar153,auVar105);
            bVar59 = (bool)((byte)uVar60 & 1);
            auVar111._0_4_ = (uint)bVar59 * auVar89._0_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar111._4_4_ = (uint)bVar59 * auVar89._4_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar111._8_4_ = (uint)bVar59 * auVar89._8_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar111._12_4_ = (uint)bVar59 * auVar89._12_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)((byte)(uVar60 >> 4) & 1);
            auVar111._16_4_ = (uint)bVar59 * auVar89._16_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)((byte)(uVar60 >> 5) & 1);
            auVar111._20_4_ = (uint)bVar59 * auVar89._20_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = (bool)((byte)(uVar60 >> 6) & 1);
            auVar111._24_4_ = (uint)bVar59 * auVar89._24_4_ | (uint)!bVar59 * 0x7f800000;
            bVar59 = SUB81(uVar60 >> 7,0);
            auVar111._28_4_ = (uint)bVar59 * auVar89._28_4_ | (uint)!bVar59 * 0x7f800000;
            auVar201._8_4_ = 0xff800000;
            auVar201._0_8_ = 0xff800000ff800000;
            auVar201._12_4_ = 0xff800000;
            auVar201._16_4_ = 0xff800000;
            auVar201._20_4_ = 0xff800000;
            auVar201._24_4_ = 0xff800000;
            auVar201._28_4_ = 0xff800000;
            auVar89 = vblendmps_avx512vl(auVar201,auVar104);
            bVar59 = (bool)((byte)uVar60 & 1);
            auVar112._0_4_ = (uint)bVar59 * auVar89._0_4_ | (uint)!bVar59 * -0x800000;
            bVar59 = (bool)((byte)(uVar60 >> 1) & 1);
            auVar112._4_4_ = (uint)bVar59 * auVar89._4_4_ | (uint)!bVar59 * -0x800000;
            bVar59 = (bool)((byte)(uVar60 >> 2) & 1);
            auVar112._8_4_ = (uint)bVar59 * auVar89._8_4_ | (uint)!bVar59 * -0x800000;
            bVar59 = (bool)((byte)(uVar60 >> 3) & 1);
            auVar112._12_4_ = (uint)bVar59 * auVar89._12_4_ | (uint)!bVar59 * -0x800000;
            bVar59 = (bool)((byte)(uVar60 >> 4) & 1);
            auVar112._16_4_ = (uint)bVar59 * auVar89._16_4_ | (uint)!bVar59 * -0x800000;
            bVar59 = (bool)((byte)(uVar60 >> 5) & 1);
            auVar112._20_4_ = (uint)bVar59 * auVar89._20_4_ | (uint)!bVar59 * -0x800000;
            bVar59 = (bool)((byte)(uVar60 >> 6) & 1);
            auVar112._24_4_ = (uint)bVar59 * auVar89._24_4_ | (uint)!bVar59 * -0x800000;
            bVar59 = SUB81(uVar60 >> 7,0);
            auVar112._28_4_ = (uint)bVar59 * auVar89._28_4_ | (uint)!bVar59 * -0x800000;
            auVar26._8_4_ = 0x36000000;
            auVar26._0_8_ = 0x3600000036000000;
            auVar26._12_4_ = 0x36000000;
            auVar26._16_4_ = 0x36000000;
            auVar26._20_4_ = 0x36000000;
            auVar26._24_4_ = 0x36000000;
            auVar26._28_4_ = 0x36000000;
            auVar89 = vmulps_avx512vl(local_a00,auVar26);
            uVar50 = vcmpps_avx512vl(auVar89,local_a20,0xe);
            uVar60 = uVar60 & uVar50;
            bVar51 = (byte)uVar60;
            if (bVar51 != 0) {
              uVar50 = vcmpps_avx512vl(auVar86,ZEXT1632(auVar69),2);
              auVar251._8_4_ = 0x7f800000;
              auVar251._0_8_ = 0x7f8000007f800000;
              auVar251._12_4_ = 0x7f800000;
              auVar251._16_4_ = 0x7f800000;
              auVar251._20_4_ = 0x7f800000;
              auVar251._24_4_ = 0x7f800000;
              auVar251._28_4_ = 0x7f800000;
              auVar266._8_4_ = 0xff800000;
              auVar266._0_8_ = 0xff800000ff800000;
              auVar266._12_4_ = 0xff800000;
              auVar266._16_4_ = 0xff800000;
              auVar266._20_4_ = 0xff800000;
              auVar266._24_4_ = 0xff800000;
              auVar266._28_4_ = 0xff800000;
              auVar86 = vblendmps_avx512vl(auVar251,auVar266);
              bVar57 = (byte)uVar50;
              uVar61 = (uint)(bVar57 & 1) * auVar86._0_4_ |
                       (uint)!(bool)(bVar57 & 1) * auVar89._0_4_;
              bVar59 = (bool)((byte)(uVar50 >> 1) & 1);
              uVar135 = (uint)bVar59 * auVar86._4_4_ | (uint)!bVar59 * auVar89._4_4_;
              bVar59 = (bool)((byte)(uVar50 >> 2) & 1);
              uVar136 = (uint)bVar59 * auVar86._8_4_ | (uint)!bVar59 * auVar89._8_4_;
              bVar59 = (bool)((byte)(uVar50 >> 3) & 1);
              uVar137 = (uint)bVar59 * auVar86._12_4_ | (uint)!bVar59 * auVar89._12_4_;
              bVar59 = (bool)((byte)(uVar50 >> 4) & 1);
              uVar138 = (uint)bVar59 * auVar86._16_4_ | (uint)!bVar59 * auVar89._16_4_;
              bVar59 = (bool)((byte)(uVar50 >> 5) & 1);
              uVar139 = (uint)bVar59 * auVar86._20_4_ | (uint)!bVar59 * auVar89._20_4_;
              bVar59 = (bool)((byte)(uVar50 >> 6) & 1);
              uVar140 = (uint)bVar59 * auVar86._24_4_ | (uint)!bVar59 * auVar89._24_4_;
              bVar59 = SUB81(uVar50 >> 7,0);
              uVar141 = (uint)bVar59 * auVar86._28_4_ | (uint)!bVar59 * auVar89._28_4_;
              auVar111._0_4_ = (bVar51 & 1) * uVar61 | !(bool)(bVar51 & 1) * auVar111._0_4_;
              bVar59 = (bool)((byte)(uVar60 >> 1) & 1);
              auVar111._4_4_ = bVar59 * uVar135 | !bVar59 * auVar111._4_4_;
              bVar59 = (bool)((byte)(uVar60 >> 2) & 1);
              auVar111._8_4_ = bVar59 * uVar136 | !bVar59 * auVar111._8_4_;
              bVar59 = (bool)((byte)(uVar60 >> 3) & 1);
              auVar111._12_4_ = bVar59 * uVar137 | !bVar59 * auVar111._12_4_;
              bVar59 = (bool)((byte)(uVar60 >> 4) & 1);
              auVar111._16_4_ = bVar59 * uVar138 | !bVar59 * auVar111._16_4_;
              bVar59 = (bool)((byte)(uVar60 >> 5) & 1);
              auVar111._20_4_ = bVar59 * uVar139 | !bVar59 * auVar111._20_4_;
              bVar59 = (bool)((byte)(uVar60 >> 6) & 1);
              auVar111._24_4_ = bVar59 * uVar140 | !bVar59 * auVar111._24_4_;
              bVar59 = SUB81(uVar60 >> 7,0);
              auVar111._28_4_ = bVar59 * uVar141 | !bVar59 * auVar111._28_4_;
              auVar86 = vblendmps_avx512vl(auVar266,auVar251);
              bVar59 = (bool)((byte)(uVar50 >> 1) & 1);
              bVar5 = (bool)((byte)(uVar50 >> 2) & 1);
              bVar6 = (bool)((byte)(uVar50 >> 3) & 1);
              bVar7 = (bool)((byte)(uVar50 >> 4) & 1);
              bVar8 = (bool)((byte)(uVar50 >> 5) & 1);
              bVar9 = (bool)((byte)(uVar50 >> 6) & 1);
              bVar10 = SUB81(uVar50 >> 7,0);
              auVar112._0_4_ =
                   (uint)(bVar51 & 1) *
                   ((uint)(bVar57 & 1) * auVar86._0_4_ | !(bool)(bVar57 & 1) * uVar61) |
                   !(bool)(bVar51 & 1) * auVar112._0_4_;
              bVar4 = (bool)((byte)(uVar60 >> 1) & 1);
              auVar112._4_4_ =
                   (uint)bVar4 * ((uint)bVar59 * auVar86._4_4_ | !bVar59 * uVar135) |
                   !bVar4 * auVar112._4_4_;
              bVar59 = (bool)((byte)(uVar60 >> 2) & 1);
              auVar112._8_4_ =
                   (uint)bVar59 * ((uint)bVar5 * auVar86._8_4_ | !bVar5 * uVar136) |
                   !bVar59 * auVar112._8_4_;
              bVar59 = (bool)((byte)(uVar60 >> 3) & 1);
              auVar112._12_4_ =
                   (uint)bVar59 * ((uint)bVar6 * auVar86._12_4_ | !bVar6 * uVar137) |
                   !bVar59 * auVar112._12_4_;
              bVar59 = (bool)((byte)(uVar60 >> 4) & 1);
              auVar112._16_4_ =
                   (uint)bVar59 * ((uint)bVar7 * auVar86._16_4_ | !bVar7 * uVar138) |
                   !bVar59 * auVar112._16_4_;
              bVar59 = (bool)((byte)(uVar60 >> 5) & 1);
              auVar112._20_4_ =
                   (uint)bVar59 * ((uint)bVar8 * auVar86._20_4_ | !bVar8 * uVar139) |
                   !bVar59 * auVar112._20_4_;
              bVar59 = (bool)((byte)(uVar60 >> 6) & 1);
              auVar112._24_4_ =
                   (uint)bVar59 * ((uint)bVar9 * auVar86._24_4_ | !bVar9 * uVar140) |
                   !bVar59 * auVar112._24_4_;
              bVar59 = SUB81(uVar60 >> 7,0);
              auVar112._28_4_ =
                   (uint)bVar59 * ((uint)bVar10 * auVar86._28_4_ | !bVar10 * uVar141) |
                   !bVar59 * auVar112._28_4_;
              bVar54 = (~bVar51 | bVar57) & bVar54;
            }
          }
          auVar262._0_4_ = local_860._0_4_ * auVar159._0_4_;
          auVar262._4_4_ = local_860._4_4_ * auVar159._4_4_;
          auVar262._8_4_ = local_860._8_4_ * auVar159._8_4_;
          auVar262._12_4_ = local_860._12_4_ * auVar159._12_4_;
          auVar262._16_4_ = local_860._16_4_ * auVar159._16_4_;
          auVar262._20_4_ = local_860._20_4_ * auVar159._20_4_;
          auVar262._28_36_ = auVar159._28_36_;
          auVar262._24_4_ = local_860._24_4_ * auVar159._24_4_;
          auVar256 = ZEXT3264(local_840);
          auVar67 = vfmadd231ps_fma(auVar262._0_32_,local_840,auVar88);
          auVar252 = ZEXT3264(_local_820);
          auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),_local_820,auVar93);
          auVar243._8_4_ = 0x7fffffff;
          auVar243._0_8_ = 0x7fffffff7fffffff;
          auVar243._12_4_ = 0x7fffffff;
          auVar243._16_4_ = 0x7fffffff;
          auVar243._20_4_ = 0x7fffffff;
          auVar243._24_4_ = 0x7fffffff;
          auVar243._28_4_ = 0x7fffffff;
          auVar86 = vandps_avx(ZEXT1632(auVar67),auVar243);
          auVar262 = ZEXT3264(_local_a40);
          _local_440 = _local_a40;
          auVar237._8_4_ = 0x3e99999a;
          auVar237._0_8_ = 0x3e99999a3e99999a;
          auVar237._12_4_ = 0x3e99999a;
          auVar237._16_4_ = 0x3e99999a;
          auVar237._20_4_ = 0x3e99999a;
          auVar237._24_4_ = 0x3e99999a;
          auVar237._28_4_ = 0x3e99999a;
          uVar12 = vcmpps_avx512vl(auVar86,auVar237,1);
          local_760._0_2_ = (short)uVar12;
          local_6e0 = vmaxps_avx(_local_a40,auVar112);
          auVar86 = vminps_avx(local_6c0,auVar111);
          uVar12 = vcmpps_avx512vl(_local_a40,auVar86,2);
          bVar51 = (byte)uVar12 & bVar47;
          uVar13 = vcmpps_avx512vl(local_6e0,local_6c0,2);
          if ((bVar47 & ((byte)uVar13 | (byte)uVar12)) != 0) {
            auVar41._4_4_ = local_860._4_4_ * auVar261._4_4_;
            auVar41._0_4_ = local_860._0_4_ * auVar261._0_4_;
            auVar41._8_4_ = local_860._8_4_ * auVar261._8_4_;
            auVar41._12_4_ = local_860._12_4_ * auVar261._12_4_;
            auVar41._16_4_ = local_860._16_4_ * auVar261._16_4_;
            auVar41._20_4_ = local_860._20_4_ * auVar261._20_4_;
            auVar41._24_4_ = local_860._24_4_ * auVar261._24_4_;
            auVar41._28_4_ = auVar86._28_4_;
            auVar67 = vfmadd213ps_fma(auVar103,local_840,auVar41);
            auVar67 = vfmadd213ps_fma(auVar87,_local_820,ZEXT1632(auVar67));
            auVar86 = vandps_avx(ZEXT1632(auVar67),auVar243);
            uVar12 = vcmpps_avx512vl(auVar86,auVar237,1);
            bVar57 = (byte)uVar12 | ~bVar54;
            auVar155._8_4_ = 2;
            auVar155._0_8_ = 0x200000002;
            auVar155._12_4_ = 2;
            auVar155._16_4_ = 2;
            auVar155._20_4_ = 2;
            auVar155._24_4_ = 2;
            auVar155._28_4_ = 2;
            auVar27._8_4_ = 3;
            auVar27._0_8_ = 0x300000003;
            auVar27._12_4_ = 3;
            auVar27._16_4_ = 3;
            auVar27._20_4_ = 3;
            auVar27._24_4_ = 3;
            auVar27._28_4_ = 3;
            auVar86 = vpblendmd_avx512vl(auVar155,auVar27);
            local_680._0_4_ = (uint)(bVar57 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar57 & 1) * 2;
            bVar59 = (bool)(bVar57 >> 1 & 1);
            local_680._4_4_ = (uint)bVar59 * auVar86._4_4_ | (uint)!bVar59 * 2;
            bVar59 = (bool)(bVar57 >> 2 & 1);
            local_680._8_4_ = (uint)bVar59 * auVar86._8_4_ | (uint)!bVar59 * 2;
            bVar59 = (bool)(bVar57 >> 3 & 1);
            local_680._12_4_ = (uint)bVar59 * auVar86._12_4_ | (uint)!bVar59 * 2;
            bVar59 = (bool)(bVar57 >> 4 & 1);
            local_680._16_4_ = (uint)bVar59 * auVar86._16_4_ | (uint)!bVar59 * 2;
            bVar59 = (bool)(bVar57 >> 5 & 1);
            local_680._20_4_ = (uint)bVar59 * auVar86._20_4_ | (uint)!bVar59 * 2;
            bVar59 = (bool)(bVar57 >> 6 & 1);
            local_680._24_4_ = (uint)bVar59 * auVar86._24_4_ | (uint)!bVar59 * 2;
            local_680._28_4_ = (uint)(bVar57 >> 7) * auVar86._28_4_ | (uint)!(bool)(bVar57 >> 7) * 2
            ;
            local_700 = vpbroadcastd_avx512vl();
            uVar12 = vpcmpd_avx512vl(local_700,local_680,5);
            bVar57 = (byte)uVar12 & bVar51;
            if (bVar57 == 0) {
              auVar157._4_4_ = uVar62;
              auVar157._0_4_ = uVar62;
              auVar157._8_4_ = uVar62;
              auVar157._12_4_ = uVar62;
              auVar157._16_4_ = uVar62;
              auVar157._20_4_ = uVar62;
              auVar157._24_4_ = uVar62;
              auVar157._28_4_ = uVar62;
              auVar86 = local_6e0;
            }
            else {
              local_6a0 = local_6e0;
              auVar69 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
              auVar67 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
              auVar11 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
              auVar68 = vminps_avx(auVar69,auVar11);
              auVar69 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
              auVar11 = vmaxps_avx(auVar67,auVar69);
              auVar183._8_4_ = 0x7fffffff;
              auVar183._0_8_ = 0x7fffffff7fffffff;
              auVar183._12_4_ = 0x7fffffff;
              auVar67 = vandps_avx(auVar68,auVar183);
              auVar69 = vandps_avx(auVar11,auVar183);
              auVar67 = vmaxps_avx(auVar67,auVar69);
              auVar69 = vmovshdup_avx(auVar67);
              auVar69 = vmaxss_avx(auVar69,auVar67);
              auVar67 = vshufpd_avx(auVar67,auVar67,1);
              auVar67 = vmaxss_avx(auVar67,auVar69);
              fVar227 = auVar67._0_4_ * 1.9073486e-06;
              local_920 = vshufps_avx(auVar11,auVar11,0xff);
              local_740 = (float)local_a40._0_4_ + fVar161;
              fStack_73c = (float)local_a40._4_4_ + fVar161;
              fStack_738 = fStack_a38 + fVar161;
              fStack_734 = fStack_a34 + fVar161;
              fStack_730 = fStack_a30 + fVar161;
              fStack_72c = fStack_a2c + fVar161;
              fStack_728 = fStack_a28 + fVar161;
              fStack_724 = fStack_a24 + fVar161;
              do {
                auVar156._8_4_ = 0x7f800000;
                auVar156._0_8_ = 0x7f8000007f800000;
                auVar156._12_4_ = 0x7f800000;
                auVar156._16_4_ = 0x7f800000;
                auVar156._20_4_ = 0x7f800000;
                auVar156._24_4_ = 0x7f800000;
                auVar156._28_4_ = 0x7f800000;
                auVar86 = vblendmps_avx512vl(auVar156,_local_a40);
                auVar125._0_4_ =
                     (uint)(bVar57 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar57 & 1) * 0x7f800000;
                bVar59 = (bool)(bVar57 >> 1 & 1);
                auVar125._4_4_ = (uint)bVar59 * auVar86._4_4_ | (uint)!bVar59 * 0x7f800000;
                bVar59 = (bool)(bVar57 >> 2 & 1);
                auVar125._8_4_ = (uint)bVar59 * auVar86._8_4_ | (uint)!bVar59 * 0x7f800000;
                bVar59 = (bool)(bVar57 >> 3 & 1);
                auVar125._12_4_ = (uint)bVar59 * auVar86._12_4_ | (uint)!bVar59 * 0x7f800000;
                bVar59 = (bool)(bVar57 >> 4 & 1);
                auVar125._16_4_ = (uint)bVar59 * auVar86._16_4_ | (uint)!bVar59 * 0x7f800000;
                bVar59 = (bool)(bVar57 >> 5 & 1);
                auVar125._20_4_ = (uint)bVar59 * auVar86._20_4_ | (uint)!bVar59 * 0x7f800000;
                auVar125._24_4_ =
                     (uint)(bVar57 >> 6) * auVar86._24_4_ | (uint)!(bool)(bVar57 >> 6) * 0x7f800000;
                auVar125._28_4_ = 0x7f800000;
                auVar86 = vshufps_avx(auVar125,auVar125,0xb1);
                auVar86 = vminps_avx(auVar125,auVar86);
                auVar87 = vshufpd_avx(auVar86,auVar86,5);
                auVar86 = vminps_avx(auVar86,auVar87);
                auVar87 = vpermpd_avx2(auVar86,0x4e);
                auVar86 = vminps_avx(auVar86,auVar87);
                uVar12 = vcmpps_avx512vl(auVar125,auVar86,0);
                bVar48 = (byte)uVar12 & bVar57;
                bVar49 = bVar57;
                if (bVar48 != 0) {
                  bVar49 = bVar48;
                }
                iVar15 = 0;
                for (uVar62 = (uint)bVar49; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
                  iVar15 = iVar15 + 1;
                }
                uVar62 = *(uint *)(local_520 + (uint)(iVar15 << 2));
                uVar61 = *(uint *)(local_440 + (uint)(iVar15 << 2));
                fVar205 = auVar64._0_4_;
                if ((float)local_9e0._0_4_ < 0.0) {
                  fVar205 = sqrtf((float)local_9e0._0_4_);
                }
                auVar67 = vinsertps_avx(ZEXT416(uVar61),ZEXT416(uVar62),0x10);
                auVar159 = ZEXT1664(auVar67);
                bVar59 = true;
                uVar60 = 0;
                do {
                  uVar162 = auVar159._0_4_;
                  auVar144._4_4_ = uVar162;
                  auVar144._0_4_ = uVar162;
                  auVar144._8_4_ = uVar162;
                  auVar144._12_4_ = uVar162;
                  auVar67 = vfmadd132ps_fma(auVar144,ZEXT816(0) << 0x40,local_9d0);
                  auVar69 = vmovshdup_avx(auVar159._0_16_);
                  fVar244 = auVar69._0_4_;
                  fVar226 = 1.0 - fVar244;
                  fVar221 = fVar244 * fVar244;
                  auVar71 = SUB6416(ZEXT464(0x40400000),0);
                  auVar70 = SUB6416(ZEXT464(0xc0a00000),0);
                  auVar68 = vfmadd213ss_fma(auVar71,auVar69,auVar70);
                  auVar11 = vfmadd213ss_fma(auVar68,ZEXT416((uint)fVar221),
                                            SUB6416(ZEXT464(0x40000000),0));
                  auVar75 = vfmadd213ss_fma(auVar71,ZEXT416((uint)fVar226),auVar70);
                  auVar75 = vfmadd213ss_fma(auVar75,ZEXT416((uint)(fVar226 * fVar226)),
                                            SUB6416(ZEXT464(0x40000000),0));
                  fVar222 = fVar226 * fVar226 * -fVar244 * 0.5;
                  fVar223 = auVar11._0_4_ * 0.5;
                  fVar224 = auVar75._0_4_ * 0.5;
                  fVar225 = fVar244 * fVar244 * -fVar226 * 0.5;
                  auVar208._0_4_ = fVar225 * (float)local_9c0._0_4_;
                  auVar208._4_4_ = fVar225 * (float)local_9c0._4_4_;
                  auVar208._8_4_ = fVar225 * fStack_9b8;
                  auVar208._12_4_ = fVar225 * fStack_9b4;
                  auVar230._4_4_ = fVar224;
                  auVar230._0_4_ = fVar224;
                  auVar230._8_4_ = fVar224;
                  auVar230._12_4_ = fVar224;
                  auVar11 = vfmadd132ps_fma(auVar230,auVar208,local_980._0_16_);
                  auVar184._4_4_ = fVar223;
                  auVar184._0_4_ = fVar223;
                  auVar184._8_4_ = fVar223;
                  auVar184._12_4_ = fVar223;
                  auVar11 = vfmadd132ps_fma(auVar184,auVar11,local_9a0._0_16_);
                  auVar209._4_4_ = fVar222;
                  auVar209._0_4_ = fVar222;
                  auVar209._8_4_ = fVar222;
                  auVar209._12_4_ = fVar222;
                  auVar11 = vfmadd132ps_fma(auVar209,auVar11,local_960._0_16_);
                  auVar75 = vfmadd231ss_fma(auVar70,auVar69,ZEXT416(0x41100000));
                  local_8a0._0_16_ = auVar75;
                  auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar69,
                                            ZEXT416(0x40800000));
                  local_8c0._0_16_ = auVar75;
                  auVar75 = vfmadd213ss_fma(auVar71,auVar69,ZEXT416(0xbf800000));
                  local_8e0._0_16_ = auVar75;
                  _local_880 = auVar11;
                  auVar11 = vsubps_avx(auVar67,auVar11);
                  auVar67 = vdpps_avx(auVar11,auVar11,0x7f);
                  fVar222 = auVar67._0_4_;
                  local_800 = auVar159;
                  if (fVar222 < 0.0) {
                    local_a00._0_4_ = fVar221;
                    local_a20._0_4_ = fVar226 * -2.0;
                    auVar256._0_4_ = sqrtf(fVar222);
                    auVar256._4_60_ = extraout_var;
                    auVar68 = ZEXT416(auVar68._0_4_);
                    auVar75 = auVar256._0_16_;
                  }
                  else {
                    auVar75 = vsqrtss_avx(auVar67,auVar67);
                    local_a20._0_4_ = fVar226 * -2.0;
                    local_a00._0_4_ = fVar221;
                  }
                  auVar72 = vfnmadd231ss_fma(ZEXT416((uint)(fVar244 * (fVar226 + fVar226))),
                                             ZEXT416((uint)fVar226),ZEXT416((uint)fVar226));
                  auVar68 = vfmadd213ss_fma(auVar68,ZEXT416((uint)(fVar244 + fVar244)),
                                            ZEXT416((uint)(fVar244 * fVar244 * 3.0)));
                  auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar69,
                                            SUB6416(ZEXT464(0x40000000),0));
                  auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar226 * fVar226 * -3.0)),
                                            ZEXT416((uint)(fVar226 + fVar226)),auVar70);
                  auVar70 = vfmadd213ss_fma(ZEXT416((uint)local_a20._0_4_),auVar69,
                                            ZEXT416((uint)local_a00._0_4_));
                  fVar221 = auVar72._0_4_ * 0.5;
                  fVar223 = auVar68._0_4_ * 0.5;
                  fVar224 = auVar71._0_4_ * 0.5;
                  fVar225 = auVar70._0_4_ * 0.5;
                  auVar210._0_4_ = fVar225 * (float)local_9c0._0_4_;
                  auVar210._4_4_ = fVar225 * (float)local_9c0._4_4_;
                  auVar210._8_4_ = fVar225 * fStack_9b8;
                  auVar210._12_4_ = fVar225 * fStack_9b4;
                  auVar185._4_4_ = fVar224;
                  auVar185._0_4_ = fVar224;
                  auVar185._8_4_ = fVar224;
                  auVar185._12_4_ = fVar224;
                  auVar68 = vfmadd132ps_fma(auVar185,auVar210,local_980._0_16_);
                  auVar166._4_4_ = fVar223;
                  auVar166._0_4_ = fVar223;
                  auVar166._8_4_ = fVar223;
                  auVar166._12_4_ = fVar223;
                  auVar68 = vfmadd132ps_fma(auVar166,auVar68,local_9a0._0_16_);
                  auVar264._4_4_ = fVar221;
                  auVar264._0_4_ = fVar221;
                  auVar264._8_4_ = fVar221;
                  auVar264._12_4_ = fVar221;
                  auVar68 = vfmadd132ps_fma(auVar264,auVar68,local_960._0_16_);
                  local_a00._0_16_ = vdpps_avx(auVar68,auVar68,0x7f);
                  auVar42._12_4_ = 0;
                  auVar42._0_12_ = ZEXT812(0);
                  fVar221 = local_a00._0_4_;
                  auVar70 = vrsqrt14ss_avx512f(auVar42 << 0x20,ZEXT416((uint)fVar221));
                  fVar223 = auVar70._0_4_;
                  local_a20._0_16_ = vrcp14ss_avx512f(auVar42 << 0x20,ZEXT416((uint)fVar221));
                  auVar17._8_4_ = 0x80000000;
                  auVar17._0_8_ = 0x8000000080000000;
                  auVar17._12_4_ = 0x80000000;
                  auVar71 = vxorps_avx512vl(local_a00._0_16_,auVar17);
                  auVar70 = vfnmadd213ss_fma(local_a20._0_16_,local_a00._0_16_,
                                             SUB6416(ZEXT464(0x40000000),0));
                  uVar62 = auVar75._0_4_;
                  if (fVar221 < auVar71._0_4_) {
                    fVar224 = sqrtf(fVar221);
                    auVar75 = ZEXT416(uVar62);
                  }
                  else {
                    auVar71 = vsqrtss_avx(local_a00._0_16_,local_a00._0_16_);
                    fVar224 = auVar71._0_4_;
                  }
                  fVar221 = fVar223 * 1.5 + fVar221 * -0.5 * fVar223 * fVar223 * fVar223;
                  auVar145._0_4_ = auVar68._0_4_ * fVar221;
                  auVar145._4_4_ = auVar68._4_4_ * fVar221;
                  auVar145._8_4_ = auVar68._8_4_ * fVar221;
                  auVar145._12_4_ = auVar68._12_4_ * fVar221;
                  auVar71 = vdpps_avx(auVar11,auVar145,0x7f);
                  fVar226 = auVar75._0_4_;
                  fVar223 = auVar71._0_4_;
                  auVar146._0_4_ = fVar223 * fVar223;
                  auVar146._4_4_ = auVar71._4_4_ * auVar71._4_4_;
                  auVar146._8_4_ = auVar71._8_4_ * auVar71._8_4_;
                  auVar146._12_4_ = auVar71._12_4_ * auVar71._12_4_;
                  auVar72 = vsubps_avx512vl(auVar67,auVar146);
                  fVar225 = auVar72._0_4_;
                  auVar167._4_12_ = ZEXT812(0) << 0x20;
                  auVar167._0_4_ = fVar225;
                  auVar65 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar167);
                  auVar73 = vmulss_avx512f(auVar72,ZEXT416(0xbf000000));
                  if (fVar225 < 0.0) {
                    local_910 = fVar221;
                    fStack_90c = fVar221;
                    fStack_908 = fVar221;
                    fStack_904 = fVar221;
                    local_900 = auVar65;
                    fVar225 = sqrtf(fVar225);
                    auVar73 = ZEXT416(auVar73._0_4_);
                    auVar75 = ZEXT416(uVar62);
                    auVar72 = local_900;
                    fVar221 = local_910;
                    fVar244 = fStack_90c;
                    fVar245 = fStack_908;
                    fVar246 = fStack_904;
                  }
                  else {
                    auVar72 = vsqrtss_avx(auVar72,auVar72);
                    fVar225 = auVar72._0_4_;
                    auVar72 = auVar65;
                    fVar244 = fVar221;
                    fVar245 = fVar221;
                    fVar246 = fVar221;
                  }
                  auVar261 = ZEXT1664(auVar11);
                  auVar168._0_4_ = (float)local_8e0._0_4_ * (float)local_9c0._0_4_;
                  auVar168._4_4_ = (float)local_8e0._0_4_ * (float)local_9c0._4_4_;
                  auVar168._8_4_ = (float)local_8e0._0_4_ * fStack_9b8;
                  auVar168._12_4_ = (float)local_8e0._0_4_ * fStack_9b4;
                  auVar186._4_4_ = local_8c0._0_4_;
                  auVar186._0_4_ = local_8c0._0_4_;
                  auVar186._8_4_ = local_8c0._0_4_;
                  auVar186._12_4_ = local_8c0._0_4_;
                  auVar63 = vfmadd132ps_fma(auVar186,auVar168,local_980._0_16_);
                  auVar169._4_4_ = local_8a0._0_4_;
                  auVar169._0_4_ = local_8a0._0_4_;
                  auVar169._8_4_ = local_8a0._0_4_;
                  auVar169._12_4_ = local_8a0._0_4_;
                  auVar63 = vfmadd132ps_fma(auVar169,auVar63,local_9a0._0_16_);
                  auVar69 = vfmadd213ss_fma(auVar69,SUB6416(ZEXT464(0xc0400000),0),
                                            ZEXT416(0x40000000));
                  uVar162 = auVar69._0_4_;
                  auVar187._4_4_ = uVar162;
                  auVar187._0_4_ = uVar162;
                  auVar187._8_4_ = uVar162;
                  auVar187._12_4_ = uVar162;
                  auVar69 = vfmadd132ps_fma(auVar187,auVar63,local_960._0_16_);
                  auVar170._0_4_ = auVar69._0_4_ * (float)local_a00._0_4_;
                  auVar170._4_4_ = auVar69._4_4_ * (float)local_a00._0_4_;
                  auVar170._8_4_ = auVar69._8_4_ * (float)local_a00._0_4_;
                  auVar170._12_4_ = auVar69._12_4_ * (float)local_a00._0_4_;
                  auVar69 = vdpps_avx(auVar68,auVar69,0x7f);
                  fVar180 = auVar69._0_4_;
                  auVar188._0_4_ = auVar68._0_4_ * fVar180;
                  auVar188._4_4_ = auVar68._4_4_ * fVar180;
                  auVar188._8_4_ = auVar68._8_4_ * fVar180;
                  auVar188._12_4_ = auVar68._12_4_ * fVar180;
                  auVar69 = vsubps_avx(auVar170,auVar188);
                  fVar180 = auVar70._0_4_ * (float)local_a20._0_4_;
                  auVar63 = vmaxss_avx(ZEXT416((uint)fVar227),
                                       ZEXT416((uint)(local_800._0_4_ * fVar205 * 1.9073486e-06)));
                  auVar18._8_4_ = 0x80000000;
                  auVar18._0_8_ = 0x8000000080000000;
                  auVar18._12_4_ = 0x80000000;
                  auVar130._16_48_ = local_800._16_48_;
                  auVar74 = vxorps_avx512vl(auVar68,auVar18);
                  auVar189._0_4_ = fVar221 * auVar69._0_4_ * fVar180;
                  auVar189._4_4_ = fVar244 * auVar69._4_4_ * fVar180;
                  auVar189._8_4_ = fVar245 * auVar69._8_4_ * fVar180;
                  auVar189._12_4_ = fVar246 * auVar69._12_4_ * fVar180;
                  auVar262 = ZEXT1664(auVar145);
                  auVar69 = vdpps_avx(auVar74,auVar145,0x7f);
                  auVar70 = vfmadd213ss_fma(auVar75,ZEXT416((uint)fVar227),auVar63);
                  auVar75 = vdpps_avx(auVar11,auVar189,0x7f);
                  auVar142 = vfmadd213ss_fma(ZEXT416((uint)(fVar226 + 1.0)),
                                             ZEXT416((uint)(fVar227 / fVar224)),auVar70);
                  fVar221 = auVar69._0_4_ + auVar75._0_4_;
                  auVar69 = vdpps_avx(local_9d0,auVar145,0x7f);
                  auVar75 = vdpps_avx(auVar11,auVar74,0x7f);
                  auVar70 = vmulss_avx512f(auVar73,auVar72);
                  fVar224 = auVar65._0_4_ * 1.5 + auVar70._0_4_ * auVar72._0_4_ * auVar72._0_4_;
                  auVar70 = vdpps_avx(auVar11,local_9d0,0x7f);
                  auVar65 = vfnmadd231ss_fma(auVar75,auVar71,ZEXT416((uint)fVar221));
                  auVar70 = vfnmadd231ss_fma(auVar70,auVar71,auVar69);
                  auVar75 = vpermilps_avx(_local_880,0xff);
                  fVar225 = fVar225 - auVar75._0_4_;
                  auVar72 = vshufps_avx(auVar68,auVar68,0xff);
                  auVar75 = vfmsub213ss_fma(auVar65,ZEXT416((uint)fVar224),auVar72);
                  auVar254._8_4_ = 0x80000000;
                  auVar254._0_8_ = 0x8000000080000000;
                  auVar254._12_4_ = 0x80000000;
                  auVar256 = ZEXT1664(auVar254);
                  auVar249._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
                  auVar249._8_4_ = auVar75._8_4_ ^ 0x80000000;
                  auVar249._12_4_ = auVar75._12_4_ ^ 0x80000000;
                  auVar252 = ZEXT1664(auVar249);
                  auVar70 = ZEXT416((uint)(auVar70._0_4_ * fVar224));
                  auVar65 = vfmsub231ss_fma(ZEXT416((uint)(auVar69._0_4_ * auVar75._0_4_)),
                                            ZEXT416((uint)fVar221),auVar70);
                  auVar75 = vinsertps_avx(auVar249,auVar70,0x1c);
                  auVar235._0_8_ = auVar69._0_8_ ^ 0x8000000080000000;
                  auVar235._8_4_ = auVar69._8_4_ ^ 0x80000000;
                  auVar235._12_4_ = auVar69._12_4_ ^ 0x80000000;
                  auVar70 = vinsertps_avx(ZEXT416((uint)fVar221),auVar235,0x10);
                  auVar211._0_4_ = auVar65._0_4_;
                  auVar211._4_4_ = auVar211._0_4_;
                  auVar211._8_4_ = auVar211._0_4_;
                  auVar211._12_4_ = auVar211._0_4_;
                  auVar69 = vdivps_avx(auVar75,auVar211);
                  auVar75 = vdivps_avx(auVar70,auVar211);
                  auVar212._0_4_ = fVar223 * auVar69._0_4_ + fVar225 * auVar75._0_4_;
                  auVar212._4_4_ = fVar223 * auVar69._4_4_ + fVar225 * auVar75._4_4_;
                  auVar212._8_4_ = fVar223 * auVar69._8_4_ + fVar225 * auVar75._8_4_;
                  auVar212._12_4_ = fVar223 * auVar69._12_4_ + fVar225 * auVar75._12_4_;
                  auVar69 = vsubps_avx(local_800._0_16_,auVar212);
                  auVar159 = ZEXT1664(auVar69);
                  auVar19._8_4_ = 0x7fffffff;
                  auVar19._0_8_ = 0x7fffffff7fffffff;
                  auVar19._12_4_ = 0x7fffffff;
                  auVar75 = vandps_avx512vl(auVar71,auVar19);
                  if (auVar75._0_4_ < auVar142._0_4_) {
                    auVar75 = vfmadd231ss_fma(ZEXT416((uint)(auVar142._0_4_ + auVar63._0_4_)),
                                              local_920,ZEXT416(0x36000000));
                    auVar20._8_4_ = 0x7fffffff;
                    auVar20._0_8_ = 0x7fffffff7fffffff;
                    auVar20._12_4_ = 0x7fffffff;
                    auVar70 = vandps_avx512vl(ZEXT416((uint)fVar225),auVar20);
                    if (auVar70._0_4_ < auVar75._0_4_) {
                      fVar205 = auVar69._0_4_ + (float)local_930._0_4_;
                      if (fVar205 < fVar160) {
LAB_01acb82f:
                        bVar49 = 0;
                        goto LAB_01acb859;
                      }
                      fVar221 = *(float *)(ray + k * 4 + 0x200);
                      if (fVar205 <= fVar221) {
                        auVar69 = vmovshdup_avx(auVar69);
                        bVar49 = 0;
                        if ((auVar69._0_4_ < 0.0) || (1.0 < auVar69._0_4_)) goto LAB_01acb859;
                        auVar213._0_12_ = ZEXT812(0);
                        auVar213._12_4_ = 0;
                        auVar130._0_16_ = auVar213;
                        auVar129._4_60_ = auVar130._4_60_;
                        auVar129._0_4_ = fVar222;
                        auVar69 = vrsqrt14ss_avx512f(auVar213,auVar129._0_16_);
                        fVar222 = auVar69._0_4_;
                        auVar67 = vmulss_avx512f(auVar67,ZEXT416(0xbf000000));
                        pGVar2 = (context->scene->geometries).items[uVar58].ptr;
                        if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) goto LAB_01acb82f;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (bVar49 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                        goto LAB_01acb859;
                        fVar222 = fVar222 * 1.5 + auVar67._0_4_ * fVar222 * fVar222 * fVar222;
                        auVar190._0_4_ = auVar11._0_4_ * fVar222;
                        auVar190._4_4_ = auVar11._4_4_ * fVar222;
                        auVar190._8_4_ = auVar11._8_4_ * fVar222;
                        auVar190._12_4_ = auVar11._12_4_ * fVar222;
                        auVar75 = vfmadd213ps_fma(auVar72,auVar190,auVar68);
                        auVar67 = vshufps_avx(auVar190,auVar190,0xc9);
                        auVar69 = vshufps_avx(auVar68,auVar68,0xc9);
                        auVar191._0_4_ = auVar190._0_4_ * auVar69._0_4_;
                        auVar191._4_4_ = auVar190._4_4_ * auVar69._4_4_;
                        auVar191._8_4_ = auVar190._8_4_ * auVar69._8_4_;
                        auVar191._12_4_ = auVar190._12_4_ * auVar69._12_4_;
                        auVar68 = vfmsub231ps_fma(auVar191,auVar68,auVar67);
                        auVar67 = vshufps_avx(auVar68,auVar68,0xc9);
                        auVar69 = vshufps_avx(auVar75,auVar75,0xc9);
                        auVar68 = vshufps_avx(auVar68,auVar68,0xd2);
                        auVar147._0_4_ = auVar75._0_4_ * auVar68._0_4_;
                        auVar147._4_4_ = auVar75._4_4_ * auVar68._4_4_;
                        auVar147._8_4_ = auVar75._8_4_ * auVar68._8_4_;
                        auVar147._12_4_ = auVar75._12_4_ * auVar68._12_4_;
                        auVar67 = vfmsub231ps_fma(auVar147,auVar67,auVar69);
                        auVar260 = vbroadcastss_avx512f(ZEXT416(1));
                        local_340 = vpermps_avx512f(auVar260,auVar159);
                        auVar159 = vpermps_avx512f(auVar260,ZEXT1664(auVar67));
                        auVar260 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar260,ZEXT1664(auVar67));
                        local_380 = vbroadcastss_avx512f(auVar67);
                        local_400[0] = (RTCHitN)auVar159[0];
                        local_400[1] = (RTCHitN)auVar159[1];
                        local_400[2] = (RTCHitN)auVar159[2];
                        local_400[3] = (RTCHitN)auVar159[3];
                        local_400[4] = (RTCHitN)auVar159[4];
                        local_400[5] = (RTCHitN)auVar159[5];
                        local_400[6] = (RTCHitN)auVar159[6];
                        local_400[7] = (RTCHitN)auVar159[7];
                        local_400[8] = (RTCHitN)auVar159[8];
                        local_400[9] = (RTCHitN)auVar159[9];
                        local_400[10] = (RTCHitN)auVar159[10];
                        local_400[0xb] = (RTCHitN)auVar159[0xb];
                        local_400[0xc] = (RTCHitN)auVar159[0xc];
                        local_400[0xd] = (RTCHitN)auVar159[0xd];
                        local_400[0xe] = (RTCHitN)auVar159[0xe];
                        local_400[0xf] = (RTCHitN)auVar159[0xf];
                        local_400[0x10] = (RTCHitN)auVar159[0x10];
                        local_400[0x11] = (RTCHitN)auVar159[0x11];
                        local_400[0x12] = (RTCHitN)auVar159[0x12];
                        local_400[0x13] = (RTCHitN)auVar159[0x13];
                        local_400[0x14] = (RTCHitN)auVar159[0x14];
                        local_400[0x15] = (RTCHitN)auVar159[0x15];
                        local_400[0x16] = (RTCHitN)auVar159[0x16];
                        local_400[0x17] = (RTCHitN)auVar159[0x17];
                        local_400[0x18] = (RTCHitN)auVar159[0x18];
                        local_400[0x19] = (RTCHitN)auVar159[0x19];
                        local_400[0x1a] = (RTCHitN)auVar159[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar159[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar159[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar159[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar159[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar159[0x1f];
                        local_400[0x20] = (RTCHitN)auVar159[0x20];
                        local_400[0x21] = (RTCHitN)auVar159[0x21];
                        local_400[0x22] = (RTCHitN)auVar159[0x22];
                        local_400[0x23] = (RTCHitN)auVar159[0x23];
                        local_400[0x24] = (RTCHitN)auVar159[0x24];
                        local_400[0x25] = (RTCHitN)auVar159[0x25];
                        local_400[0x26] = (RTCHitN)auVar159[0x26];
                        local_400[0x27] = (RTCHitN)auVar159[0x27];
                        local_400[0x28] = (RTCHitN)auVar159[0x28];
                        local_400[0x29] = (RTCHitN)auVar159[0x29];
                        local_400[0x2a] = (RTCHitN)auVar159[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar159[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar159[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar159[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar159[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar159[0x2f];
                        local_400[0x30] = (RTCHitN)auVar159[0x30];
                        local_400[0x31] = (RTCHitN)auVar159[0x31];
                        local_400[0x32] = (RTCHitN)auVar159[0x32];
                        local_400[0x33] = (RTCHitN)auVar159[0x33];
                        local_400[0x34] = (RTCHitN)auVar159[0x34];
                        local_400[0x35] = (RTCHitN)auVar159[0x35];
                        local_400[0x36] = (RTCHitN)auVar159[0x36];
                        local_400[0x37] = (RTCHitN)auVar159[0x37];
                        local_400[0x38] = (RTCHitN)auVar159[0x38];
                        local_400[0x39] = (RTCHitN)auVar159[0x39];
                        local_400[0x3a] = (RTCHitN)auVar159[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar159[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar159[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar159[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar159[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar159[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_480._0_8_;
                        uStack_2b8 = local_480._8_8_;
                        uStack_2b0 = local_480._16_8_;
                        uStack_2a8 = local_480._24_8_;
                        uStack_2a0 = local_480._32_8_;
                        uStack_298 = local_480._40_8_;
                        uStack_290 = local_480._48_8_;
                        uStack_288 = local_480._56_8_;
                        auVar159 = vmovdqa64_avx512f(local_4c0);
                        local_280 = vmovdqa64_avx512f(auVar159);
                        vpcmpeqd_avx2(auVar159._0_32_,auVar159._0_32_);
                        local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar205;
                        auVar159 = vmovdqa64_avx512f(local_500);
                        local_7c0 = vmovdqa64_avx512f(auVar159);
                        local_a70.valid = (int *)local_7c0;
                        local_a70.geometryUserPtr = pGVar2->userPtr;
                        local_a70.context = context->user;
                        local_a70.hit = local_400;
                        local_a70.N = 0x10;
                        local_a70.ray = (RTCRayN *)ray;
                        if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar252 = ZEXT1664(auVar249);
                          auVar256 = ZEXT1664(auVar254);
                          auVar261 = ZEXT1664(auVar11);
                          auVar262 = ZEXT1664(auVar145);
                          (*pGVar2->occlusionFilterN)(&local_a70);
                          auVar159 = vmovdqa64_avx512f(local_7c0);
                        }
                        uVar12 = vptestmd_avx512f(auVar159,auVar159);
                        if ((short)uVar12 != 0) {
                          p_Var3 = context->args->filter;
                          if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar252 = ZEXT1664(auVar252._0_16_);
                            auVar256 = ZEXT1664(auVar256._0_16_);
                            auVar261 = ZEXT1664(auVar261._0_16_);
                            auVar262 = ZEXT1664(auVar262._0_16_);
                            (*p_Var3)(&local_a70);
                            auVar159 = vmovdqa64_avx512f(local_7c0);
                          }
                          uVar60 = vptestmd_avx512f(auVar159,auVar159);
                          auVar159 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar4 = (bool)((byte)uVar60 & 1);
                          auVar131._0_4_ =
                               (uint)bVar4 * auVar159._0_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x200);
                          bVar4 = (bool)((byte)(uVar60 >> 1) & 1);
                          auVar131._4_4_ =
                               (uint)bVar4 * auVar159._4_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x204);
                          bVar4 = (bool)((byte)(uVar60 >> 2) & 1);
                          auVar131._8_4_ =
                               (uint)bVar4 * auVar159._8_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x208);
                          bVar4 = (bool)((byte)(uVar60 >> 3) & 1);
                          auVar131._12_4_ =
                               (uint)bVar4 * auVar159._12_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x20c);
                          bVar4 = (bool)((byte)(uVar60 >> 4) & 1);
                          auVar131._16_4_ =
                               (uint)bVar4 * auVar159._16_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x210);
                          bVar4 = (bool)((byte)(uVar60 >> 5) & 1);
                          auVar131._20_4_ =
                               (uint)bVar4 * auVar159._20_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x214);
                          bVar4 = (bool)((byte)(uVar60 >> 6) & 1);
                          auVar131._24_4_ =
                               (uint)bVar4 * auVar159._24_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x218);
                          bVar4 = (bool)((byte)(uVar60 >> 7) & 1);
                          auVar131._28_4_ =
                               (uint)bVar4 * auVar159._28_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x21c);
                          bVar4 = (bool)((byte)(uVar60 >> 8) & 1);
                          auVar131._32_4_ =
                               (uint)bVar4 * auVar159._32_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x220);
                          bVar4 = (bool)((byte)(uVar60 >> 9) & 1);
                          auVar131._36_4_ =
                               (uint)bVar4 * auVar159._36_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x224);
                          bVar4 = (bool)((byte)(uVar60 >> 10) & 1);
                          auVar131._40_4_ =
                               (uint)bVar4 * auVar159._40_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x228);
                          bVar4 = (bool)((byte)(uVar60 >> 0xb) & 1);
                          auVar131._44_4_ =
                               (uint)bVar4 * auVar159._44_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x22c);
                          bVar4 = (bool)((byte)(uVar60 >> 0xc) & 1);
                          auVar131._48_4_ =
                               (uint)bVar4 * auVar159._48_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x230);
                          bVar4 = (bool)((byte)(uVar60 >> 0xd) & 1);
                          auVar131._52_4_ =
                               (uint)bVar4 * auVar159._52_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x234);
                          bVar4 = (bool)((byte)(uVar60 >> 0xe) & 1);
                          auVar131._56_4_ =
                               (uint)bVar4 * auVar159._56_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x238);
                          bVar4 = SUB81(uVar60 >> 0xf,0);
                          auVar131._60_4_ =
                               (uint)bVar4 * auVar159._60_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x23c);
                          *(undefined1 (*) [64])(local_a70.ray + 0x200) = auVar131;
                          bVar49 = 1;
                          if ((short)uVar60 != 0) goto LAB_01acb859;
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar221;
                      }
                      bVar49 = 0;
                      goto LAB_01acb859;
                    }
                  }
                  bVar59 = uVar60 < 4;
                  uVar60 = uVar60 + 1;
                } while (uVar60 != 5);
                bVar59 = false;
                bVar49 = 5;
LAB_01acb859:
                bVar56 = (bool)(bVar56 | bVar59 & bVar49);
                uVar162 = *(undefined4 *)(ray + k * 4 + 0x200);
                auVar157._4_4_ = uVar162;
                auVar157._0_4_ = uVar162;
                auVar157._8_4_ = uVar162;
                auVar157._12_4_ = uVar162;
                auVar157._16_4_ = uVar162;
                auVar157._20_4_ = uVar162;
                auVar157._24_4_ = uVar162;
                auVar157._28_4_ = uVar162;
                auVar44._4_4_ = fStack_73c;
                auVar44._0_4_ = local_740;
                auVar44._8_4_ = fStack_738;
                auVar44._12_4_ = fStack_734;
                auVar44._16_4_ = fStack_730;
                auVar44._20_4_ = fStack_72c;
                auVar44._24_4_ = fStack_728;
                auVar44._28_4_ = fStack_724;
                uVar12 = vcmpps_avx512vl(auVar157,auVar44,0xd);
                bVar57 = ~('\x01' << ((byte)iVar15 & 0x1f)) & bVar57 & (byte)uVar12;
                auVar86 = local_6a0;
              } while (bVar57 != 0);
            }
            auVar159 = ZEXT3264(local_6e0);
            bVar54 = local_760[0] | ~bVar54;
            auVar178._0_4_ = fVar161 + auVar86._0_4_;
            auVar178._4_4_ = fVar161 + auVar86._4_4_;
            auVar178._8_4_ = fVar161 + auVar86._8_4_;
            auVar178._12_4_ = fVar161 + auVar86._12_4_;
            auVar178._16_4_ = fVar161 + auVar86._16_4_;
            auVar178._20_4_ = fVar161 + auVar86._20_4_;
            auVar178._24_4_ = fVar161 + auVar86._24_4_;
            auVar178._28_4_ = fVar161 + auVar86._28_4_;
            uVar12 = vcmpps_avx512vl(auVar178,auVar157,2);
            bVar47 = (byte)uVar13 & bVar47 & (byte)uVar12;
            auVar179._8_4_ = 2;
            auVar179._0_8_ = 0x200000002;
            auVar179._12_4_ = 2;
            auVar179._16_4_ = 2;
            auVar179._20_4_ = 2;
            auVar179._24_4_ = 2;
            auVar179._28_4_ = 2;
            auVar28._8_4_ = 3;
            auVar28._0_8_ = 0x300000003;
            auVar28._12_4_ = 3;
            auVar28._16_4_ = 3;
            auVar28._20_4_ = 3;
            auVar28._24_4_ = 3;
            auVar28._28_4_ = 3;
            auVar86 = vpblendmd_avx512vl(auVar179,auVar28);
            auVar126._0_4_ = (uint)(bVar54 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar54 & 1) * 2;
            bVar59 = (bool)(bVar54 >> 1 & 1);
            auVar126._4_4_ = (uint)bVar59 * auVar86._4_4_ | (uint)!bVar59 * 2;
            bVar59 = (bool)(bVar54 >> 2 & 1);
            auVar126._8_4_ = (uint)bVar59 * auVar86._8_4_ | (uint)!bVar59 * 2;
            bVar59 = (bool)(bVar54 >> 3 & 1);
            auVar126._12_4_ = (uint)bVar59 * auVar86._12_4_ | (uint)!bVar59 * 2;
            bVar59 = (bool)(bVar54 >> 4 & 1);
            auVar126._16_4_ = (uint)bVar59 * auVar86._16_4_ | (uint)!bVar59 * 2;
            bVar59 = (bool)(bVar54 >> 5 & 1);
            auVar126._20_4_ = (uint)bVar59 * auVar86._20_4_ | (uint)!bVar59 * 2;
            bVar59 = (bool)(bVar54 >> 6 & 1);
            auVar126._24_4_ = (uint)bVar59 * auVar86._24_4_ | (uint)!bVar59 * 2;
            auVar126._28_4_ = (uint)(bVar54 >> 7) * auVar86._28_4_ | (uint)!(bool)(bVar54 >> 7) * 2;
            uVar12 = vpcmpd_avx512vl(local_700,auVar126,5);
            bVar54 = (byte)uVar12 & bVar47;
            if (bVar54 != 0) {
              auVar69 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
              auVar67 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
              auVar11 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
              auVar68 = vminps_avx(auVar69,auVar11);
              auVar69 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
              auVar11 = vmaxps_avx(auVar67,auVar69);
              auVar192._8_4_ = 0x7fffffff;
              auVar192._0_8_ = 0x7fffffff7fffffff;
              auVar192._12_4_ = 0x7fffffff;
              auVar67 = vandps_avx(auVar68,auVar192);
              auVar69 = vandps_avx(auVar11,auVar192);
              auVar67 = vmaxps_avx(auVar67,auVar69);
              auVar69 = vmovshdup_avx(auVar67);
              auVar69 = vmaxss_avx(auVar69,auVar67);
              auVar67 = vshufpd_avx(auVar67,auVar67,1);
              auVar67 = vmaxss_avx(auVar67,auVar69);
              fVar227 = auVar67._0_4_ * 1.9073486e-06;
              local_920 = vshufps_avx(auVar11,auVar11,0xff);
              local_740 = fVar161 + local_6e0._0_4_;
              fStack_73c = fVar161 + local_6e0._4_4_;
              fStack_738 = fVar161 + local_6e0._8_4_;
              fStack_734 = fVar161 + local_6e0._12_4_;
              fStack_730 = fVar161 + local_6e0._16_4_;
              fStack_72c = fVar161 + local_6e0._20_4_;
              fStack_728 = fVar161 + local_6e0._24_4_;
              fStack_724 = fVar161 + local_6e0._28_4_;
              _local_a40 = local_6e0;
              local_760 = auVar126;
              do {
                auVar158._8_4_ = 0x7f800000;
                auVar158._0_8_ = 0x7f8000007f800000;
                auVar158._12_4_ = 0x7f800000;
                auVar158._16_4_ = 0x7f800000;
                auVar158._20_4_ = 0x7f800000;
                auVar158._24_4_ = 0x7f800000;
                auVar158._28_4_ = 0x7f800000;
                auVar86 = vblendmps_avx512vl(auVar158,auVar159._0_32_);
                auVar127._0_4_ =
                     (uint)(bVar54 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar54 & 1) * 0x7f800000;
                bVar59 = (bool)(bVar54 >> 1 & 1);
                auVar127._4_4_ = (uint)bVar59 * auVar86._4_4_ | (uint)!bVar59 * 0x7f800000;
                bVar59 = (bool)(bVar54 >> 2 & 1);
                auVar127._8_4_ = (uint)bVar59 * auVar86._8_4_ | (uint)!bVar59 * 0x7f800000;
                bVar59 = (bool)(bVar54 >> 3 & 1);
                auVar127._12_4_ = (uint)bVar59 * auVar86._12_4_ | (uint)!bVar59 * 0x7f800000;
                bVar59 = (bool)(bVar54 >> 4 & 1);
                auVar127._16_4_ = (uint)bVar59 * auVar86._16_4_ | (uint)!bVar59 * 0x7f800000;
                bVar59 = (bool)(bVar54 >> 5 & 1);
                auVar127._20_4_ = (uint)bVar59 * auVar86._20_4_ | (uint)!bVar59 * 0x7f800000;
                auVar127._24_4_ =
                     (uint)(bVar54 >> 6) * auVar86._24_4_ | (uint)!(bool)(bVar54 >> 6) * 0x7f800000;
                auVar127._28_4_ = 0x7f800000;
                auVar86 = vshufps_avx(auVar127,auVar127,0xb1);
                auVar86 = vminps_avx(auVar127,auVar86);
                auVar87 = vshufpd_avx(auVar86,auVar86,5);
                auVar86 = vminps_avx(auVar86,auVar87);
                auVar87 = vpermpd_avx2(auVar86,0x4e);
                auVar86 = vminps_avx(auVar86,auVar87);
                uVar12 = vcmpps_avx512vl(auVar127,auVar86,0);
                bVar49 = (byte)uVar12 & bVar54;
                bVar57 = bVar54;
                if (bVar49 != 0) {
                  bVar57 = bVar49;
                }
                iVar15 = 0;
                for (uVar62 = (uint)bVar57; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
                  iVar15 = iVar15 + 1;
                }
                uVar62 = *(uint *)(local_540 + (uint)(iVar15 << 2));
                uVar61 = *(uint *)(local_6c0 + (uint)(iVar15 << 2));
                fVar205 = auVar66._0_4_;
                if ((float)local_9e0._0_4_ < 0.0) {
                  fVar205 = sqrtf((float)local_9e0._0_4_);
                }
                auVar67 = vinsertps_avx(ZEXT416(uVar61),ZEXT416(uVar62),0x10);
                auVar260 = ZEXT1664(auVar67);
                bVar59 = true;
                uVar60 = 0;
                do {
                  uVar162 = auVar260._0_4_;
                  auVar148._4_4_ = uVar162;
                  auVar148._0_4_ = uVar162;
                  auVar148._8_4_ = uVar162;
                  auVar148._12_4_ = uVar162;
                  auVar67 = vfmadd132ps_fma(auVar148,ZEXT816(0) << 0x40,local_9d0);
                  auVar69 = vmovshdup_avx(auVar260._0_16_);
                  fVar244 = auVar69._0_4_;
                  fVar226 = 1.0 - fVar244;
                  fVar221 = fVar244 * fVar244;
                  auVar71 = SUB6416(ZEXT464(0x40400000),0);
                  auVar70 = SUB6416(ZEXT464(0xc0a00000),0);
                  auVar68 = vfmadd213ss_fma(auVar71,auVar69,auVar70);
                  auVar11 = vfmadd213ss_fma(auVar68,ZEXT416((uint)fVar221),
                                            SUB6416(ZEXT464(0x40000000),0));
                  auVar75 = vfmadd213ss_fma(auVar71,ZEXT416((uint)fVar226),auVar70);
                  auVar75 = vfmadd213ss_fma(auVar75,ZEXT416((uint)(fVar226 * fVar226)),
                                            SUB6416(ZEXT464(0x40000000),0));
                  fVar222 = fVar226 * fVar226 * -fVar244 * 0.5;
                  fVar223 = auVar11._0_4_ * 0.5;
                  fVar224 = auVar75._0_4_ * 0.5;
                  fVar225 = fVar244 * fVar244 * -fVar226 * 0.5;
                  auVar214._0_4_ = fVar225 * (float)local_9c0._0_4_;
                  auVar214._4_4_ = fVar225 * (float)local_9c0._4_4_;
                  auVar214._8_4_ = fVar225 * fStack_9b8;
                  auVar214._12_4_ = fVar225 * fStack_9b4;
                  auVar231._4_4_ = fVar224;
                  auVar231._0_4_ = fVar224;
                  auVar231._8_4_ = fVar224;
                  auVar231._12_4_ = fVar224;
                  auVar11 = vfmadd132ps_fma(auVar231,auVar214,local_980._0_16_);
                  auVar193._4_4_ = fVar223;
                  auVar193._0_4_ = fVar223;
                  auVar193._8_4_ = fVar223;
                  auVar193._12_4_ = fVar223;
                  auVar11 = vfmadd132ps_fma(auVar193,auVar11,local_9a0._0_16_);
                  auVar215._4_4_ = fVar222;
                  auVar215._0_4_ = fVar222;
                  auVar215._8_4_ = fVar222;
                  auVar215._12_4_ = fVar222;
                  auVar11 = vfmadd132ps_fma(auVar215,auVar11,local_960._0_16_);
                  auVar75 = vfmadd231ss_fma(auVar70,auVar69,ZEXT416(0x41100000));
                  local_8a0._0_16_ = auVar75;
                  auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar69,
                                            ZEXT416(0x40800000));
                  local_8c0._0_16_ = auVar75;
                  auVar75 = vfmadd213ss_fma(auVar71,auVar69,ZEXT416(0xbf800000));
                  local_8e0._0_16_ = auVar75;
                  _local_880 = auVar11;
                  auVar11 = vsubps_avx(auVar67,auVar11);
                  auVar67 = vdpps_avx(auVar11,auVar11,0x7f);
                  fVar222 = auVar67._0_4_;
                  local_800 = auVar260;
                  if (fVar222 < 0.0) {
                    local_a00._0_4_ = fVar221;
                    local_a20._0_4_ = fVar226 * -2.0;
                    auVar261._0_4_ = sqrtf(fVar222);
                    auVar261._4_60_ = extraout_var_00;
                    auVar68 = ZEXT416(auVar68._0_4_);
                    auVar75 = auVar261._0_16_;
                  }
                  else {
                    auVar75 = vsqrtss_avx(auVar67,auVar67);
                    local_a20._0_4_ = fVar226 * -2.0;
                    local_a00._0_4_ = fVar221;
                  }
                  auVar72 = vfnmadd231ss_fma(ZEXT416((uint)(fVar244 * (fVar226 + fVar226))),
                                             ZEXT416((uint)fVar226),ZEXT416((uint)fVar226));
                  auVar68 = vfmadd213ss_fma(auVar68,ZEXT416((uint)(fVar244 + fVar244)),
                                            ZEXT416((uint)(fVar244 * fVar244 * 3.0)));
                  auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar69,
                                            SUB6416(ZEXT464(0x40000000),0));
                  auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar226 * fVar226 * -3.0)),
                                            ZEXT416((uint)(fVar226 + fVar226)),auVar70);
                  auVar70 = vfmadd213ss_fma(ZEXT416((uint)local_a20._0_4_),auVar69,
                                            ZEXT416((uint)local_a00._0_4_));
                  fVar221 = auVar72._0_4_ * 0.5;
                  fVar223 = auVar68._0_4_ * 0.5;
                  fVar224 = auVar71._0_4_ * 0.5;
                  fVar225 = auVar70._0_4_ * 0.5;
                  auVar216._0_4_ = fVar225 * (float)local_9c0._0_4_;
                  auVar216._4_4_ = fVar225 * (float)local_9c0._4_4_;
                  auVar216._8_4_ = fVar225 * fStack_9b8;
                  auVar216._12_4_ = fVar225 * fStack_9b4;
                  auVar194._4_4_ = fVar224;
                  auVar194._0_4_ = fVar224;
                  auVar194._8_4_ = fVar224;
                  auVar194._12_4_ = fVar224;
                  auVar68 = vfmadd132ps_fma(auVar194,auVar216,local_980._0_16_);
                  auVar171._4_4_ = fVar223;
                  auVar171._0_4_ = fVar223;
                  auVar171._8_4_ = fVar223;
                  auVar171._12_4_ = fVar223;
                  auVar68 = vfmadd132ps_fma(auVar171,auVar68,local_9a0._0_16_);
                  auVar265._4_4_ = fVar221;
                  auVar265._0_4_ = fVar221;
                  auVar265._8_4_ = fVar221;
                  auVar265._12_4_ = fVar221;
                  auVar68 = vfmadd132ps_fma(auVar265,auVar68,local_960._0_16_);
                  local_a00._0_16_ = vdpps_avx(auVar68,auVar68,0x7f);
                  auVar43._12_4_ = 0;
                  auVar43._0_12_ = ZEXT812(0);
                  fVar221 = local_a00._0_4_;
                  auVar70 = vrsqrt14ss_avx512f(auVar43 << 0x20,ZEXT416((uint)fVar221));
                  fVar223 = auVar70._0_4_;
                  local_a20._0_16_ = vrcp14ss_avx512f(auVar43 << 0x20,ZEXT416((uint)fVar221));
                  auVar21._8_4_ = 0x80000000;
                  auVar21._0_8_ = 0x8000000080000000;
                  auVar21._12_4_ = 0x80000000;
                  auVar71 = vxorps_avx512vl(local_a00._0_16_,auVar21);
                  auVar70 = vfnmadd213ss_fma(local_a20._0_16_,local_a00._0_16_,
                                             SUB6416(ZEXT464(0x40000000),0));
                  uVar62 = auVar75._0_4_;
                  if (fVar221 < auVar71._0_4_) {
                    fVar224 = sqrtf(fVar221);
                    auVar75 = ZEXT416(uVar62);
                  }
                  else {
                    auVar71 = vsqrtss_avx(local_a00._0_16_,local_a00._0_16_);
                    fVar224 = auVar71._0_4_;
                  }
                  fVar221 = fVar223 * 1.5 + fVar221 * -0.5 * fVar223 * fVar223 * fVar223;
                  auVar149._0_4_ = auVar68._0_4_ * fVar221;
                  auVar149._4_4_ = auVar68._4_4_ * fVar221;
                  auVar149._8_4_ = auVar68._8_4_ * fVar221;
                  auVar149._12_4_ = auVar68._12_4_ * fVar221;
                  auVar71 = vdpps_avx(auVar11,auVar149,0x7f);
                  fVar226 = auVar75._0_4_;
                  fVar223 = auVar71._0_4_;
                  auVar150._0_4_ = fVar223 * fVar223;
                  auVar150._4_4_ = auVar71._4_4_ * auVar71._4_4_;
                  auVar150._8_4_ = auVar71._8_4_ * auVar71._8_4_;
                  auVar150._12_4_ = auVar71._12_4_ * auVar71._12_4_;
                  auVar72 = vsubps_avx512vl(auVar67,auVar150);
                  fVar225 = auVar72._0_4_;
                  auVar172._4_12_ = ZEXT812(0) << 0x20;
                  auVar172._0_4_ = fVar225;
                  auVar65 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar172);
                  auVar73 = vmulss_avx512f(auVar72,ZEXT416(0xbf000000));
                  if (fVar225 < 0.0) {
                    local_910 = fVar221;
                    fStack_90c = fVar221;
                    fStack_908 = fVar221;
                    fStack_904 = fVar221;
                    local_900 = auVar65;
                    fVar225 = sqrtf(fVar225);
                    auVar73 = ZEXT416(auVar73._0_4_);
                    auVar75 = ZEXT416(uVar62);
                    auVar72 = local_900;
                    fVar221 = local_910;
                    fVar244 = fStack_90c;
                    fVar245 = fStack_908;
                    fVar246 = fStack_904;
                  }
                  else {
                    auVar72 = vsqrtss_avx(auVar72,auVar72);
                    fVar225 = auVar72._0_4_;
                    auVar72 = auVar65;
                    fVar244 = fVar221;
                    fVar245 = fVar221;
                    fVar246 = fVar221;
                  }
                  auVar261 = ZEXT1664(auVar11);
                  auVar173._0_4_ = (float)local_8e0._0_4_ * (float)local_9c0._0_4_;
                  auVar173._4_4_ = (float)local_8e0._0_4_ * (float)local_9c0._4_4_;
                  auVar173._8_4_ = (float)local_8e0._0_4_ * fStack_9b8;
                  auVar173._12_4_ = (float)local_8e0._0_4_ * fStack_9b4;
                  auVar195._4_4_ = local_8c0._0_4_;
                  auVar195._0_4_ = local_8c0._0_4_;
                  auVar195._8_4_ = local_8c0._0_4_;
                  auVar195._12_4_ = local_8c0._0_4_;
                  auVar63 = vfmadd132ps_fma(auVar195,auVar173,local_980._0_16_);
                  auVar174._4_4_ = local_8a0._0_4_;
                  auVar174._0_4_ = local_8a0._0_4_;
                  auVar174._8_4_ = local_8a0._0_4_;
                  auVar174._12_4_ = local_8a0._0_4_;
                  auVar63 = vfmadd132ps_fma(auVar174,auVar63,local_9a0._0_16_);
                  auVar69 = vfmadd213ss_fma(auVar69,SUB6416(ZEXT464(0xc0400000),0),
                                            ZEXT416(0x40000000));
                  uVar162 = auVar69._0_4_;
                  auVar196._4_4_ = uVar162;
                  auVar196._0_4_ = uVar162;
                  auVar196._8_4_ = uVar162;
                  auVar196._12_4_ = uVar162;
                  auVar69 = vfmadd132ps_fma(auVar196,auVar63,local_960._0_16_);
                  auVar175._0_4_ = auVar69._0_4_ * (float)local_a00._0_4_;
                  auVar175._4_4_ = auVar69._4_4_ * (float)local_a00._0_4_;
                  auVar175._8_4_ = auVar69._8_4_ * (float)local_a00._0_4_;
                  auVar175._12_4_ = auVar69._12_4_ * (float)local_a00._0_4_;
                  auVar69 = vdpps_avx(auVar68,auVar69,0x7f);
                  fVar180 = auVar69._0_4_;
                  auVar197._0_4_ = auVar68._0_4_ * fVar180;
                  auVar197._4_4_ = auVar68._4_4_ * fVar180;
                  auVar197._8_4_ = auVar68._8_4_ * fVar180;
                  auVar197._12_4_ = auVar68._12_4_ * fVar180;
                  auVar69 = vsubps_avx(auVar175,auVar197);
                  fVar180 = auVar70._0_4_ * (float)local_a20._0_4_;
                  auVar63 = vmaxss_avx(ZEXT416((uint)fVar227),
                                       ZEXT416((uint)(local_800._0_4_ * fVar205 * 1.9073486e-06)));
                  auVar22._8_4_ = 0x80000000;
                  auVar22._0_8_ = 0x8000000080000000;
                  auVar22._12_4_ = 0x80000000;
                  auVar133._16_48_ = local_800._16_48_;
                  auVar74 = vxorps_avx512vl(auVar68,auVar22);
                  auVar198._0_4_ = fVar221 * auVar69._0_4_ * fVar180;
                  auVar198._4_4_ = fVar244 * auVar69._4_4_ * fVar180;
                  auVar198._8_4_ = fVar245 * auVar69._8_4_ * fVar180;
                  auVar198._12_4_ = fVar246 * auVar69._12_4_ * fVar180;
                  auVar262 = ZEXT1664(auVar149);
                  auVar69 = vdpps_avx(auVar74,auVar149,0x7f);
                  auVar70 = vfmadd213ss_fma(auVar75,ZEXT416((uint)fVar227),auVar63);
                  auVar75 = vdpps_avx(auVar11,auVar198,0x7f);
                  auVar142 = vfmadd213ss_fma(ZEXT416((uint)(fVar226 + 1.0)),
                                             ZEXT416((uint)(fVar227 / fVar224)),auVar70);
                  fVar221 = auVar69._0_4_ + auVar75._0_4_;
                  auVar69 = vdpps_avx(local_9d0,auVar149,0x7f);
                  auVar75 = vdpps_avx(auVar11,auVar74,0x7f);
                  auVar70 = vmulss_avx512f(auVar73,auVar72);
                  fVar224 = auVar65._0_4_ * 1.5 + auVar70._0_4_ * auVar72._0_4_ * auVar72._0_4_;
                  auVar70 = vdpps_avx(auVar11,local_9d0,0x7f);
                  auVar65 = vfnmadd231ss_fma(auVar75,auVar71,ZEXT416((uint)fVar221));
                  auVar70 = vfnmadd231ss_fma(auVar70,auVar71,auVar69);
                  auVar75 = vpermilps_avx(_local_880,0xff);
                  fVar225 = fVar225 - auVar75._0_4_;
                  auVar72 = vshufps_avx(auVar68,auVar68,0xff);
                  auVar75 = vfmsub213ss_fma(auVar65,ZEXT416((uint)fVar224),auVar72);
                  auVar255._8_4_ = 0x80000000;
                  auVar255._0_8_ = 0x8000000080000000;
                  auVar255._12_4_ = 0x80000000;
                  auVar256 = ZEXT1664(auVar255);
                  auVar250._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
                  auVar250._8_4_ = auVar75._8_4_ ^ 0x80000000;
                  auVar250._12_4_ = auVar75._12_4_ ^ 0x80000000;
                  auVar252 = ZEXT1664(auVar250);
                  auVar70 = ZEXT416((uint)(auVar70._0_4_ * fVar224));
                  auVar65 = vfmsub231ss_fma(ZEXT416((uint)(auVar69._0_4_ * auVar75._0_4_)),
                                            ZEXT416((uint)fVar221),auVar70);
                  auVar75 = vinsertps_avx(auVar250,auVar70,0x1c);
                  auVar236._0_8_ = auVar69._0_8_ ^ 0x8000000080000000;
                  auVar236._8_4_ = auVar69._8_4_ ^ 0x80000000;
                  auVar236._12_4_ = auVar69._12_4_ ^ 0x80000000;
                  auVar70 = vinsertps_avx(ZEXT416((uint)fVar221),auVar236,0x10);
                  auVar217._0_4_ = auVar65._0_4_;
                  auVar217._4_4_ = auVar217._0_4_;
                  auVar217._8_4_ = auVar217._0_4_;
                  auVar217._12_4_ = auVar217._0_4_;
                  auVar69 = vdivps_avx(auVar75,auVar217);
                  auVar75 = vdivps_avx(auVar70,auVar217);
                  auVar218._0_4_ = fVar223 * auVar69._0_4_ + fVar225 * auVar75._0_4_;
                  auVar218._4_4_ = fVar223 * auVar69._4_4_ + fVar225 * auVar75._4_4_;
                  auVar218._8_4_ = fVar223 * auVar69._8_4_ + fVar225 * auVar75._8_4_;
                  auVar218._12_4_ = fVar223 * auVar69._12_4_ + fVar225 * auVar75._12_4_;
                  auVar69 = vsubps_avx(local_800._0_16_,auVar218);
                  auVar260 = ZEXT1664(auVar69);
                  auVar23._8_4_ = 0x7fffffff;
                  auVar23._0_8_ = 0x7fffffff7fffffff;
                  auVar23._12_4_ = 0x7fffffff;
                  auVar75 = vandps_avx512vl(auVar71,auVar23);
                  if (auVar75._0_4_ < auVar142._0_4_) {
                    auVar75 = vfmadd231ss_fma(ZEXT416((uint)(auVar142._0_4_ + auVar63._0_4_)),
                                              local_920,ZEXT416(0x36000000));
                    auVar24._8_4_ = 0x7fffffff;
                    auVar24._0_8_ = 0x7fffffff7fffffff;
                    auVar24._12_4_ = 0x7fffffff;
                    auVar70 = vandps_avx512vl(ZEXT416((uint)fVar225),auVar24);
                    if (auVar70._0_4_ < auVar75._0_4_) {
                      fVar205 = auVar69._0_4_ + (float)local_930._0_4_;
                      if (fVar205 < fVar160) {
                        bVar57 = 0;
                        goto LAB_01acc4cd;
                      }
                      fVar221 = *(float *)(ray + k * 4 + 0x200);
                      auVar252 = ZEXT464((uint)fVar221);
                      auVar159 = ZEXT3264(_local_a40);
                      if (fVar205 <= fVar221) {
                        auVar69 = vmovshdup_avx(auVar69);
                        bVar57 = 0;
                        if ((auVar69._0_4_ < 0.0) || (1.0 < auVar69._0_4_)) goto LAB_01acc4d6;
                        auVar219._0_12_ = ZEXT812(0);
                        auVar219._12_4_ = 0;
                        auVar133._0_16_ = auVar219;
                        auVar132._4_60_ = auVar133._4_60_;
                        auVar132._0_4_ = fVar222;
                        auVar69 = vrsqrt14ss_avx512f(auVar219,auVar132._0_16_);
                        fVar222 = auVar69._0_4_;
                        auVar67 = vmulss_avx512f(auVar67,ZEXT416(0xbf000000));
                        pGVar2 = (context->scene->geometries).items[uVar58].ptr;
                        if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                          bVar57 = 0;
                          goto LAB_01acc4d6;
                        }
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (bVar57 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                        goto LAB_01acc4d6;
                        fVar222 = fVar222 * 1.5 + auVar67._0_4_ * fVar222 * fVar222 * fVar222;
                        auVar199._0_4_ = auVar11._0_4_ * fVar222;
                        auVar199._4_4_ = auVar11._4_4_ * fVar222;
                        auVar199._8_4_ = auVar11._8_4_ * fVar222;
                        auVar199._12_4_ = auVar11._12_4_ * fVar222;
                        auVar75 = vfmadd213ps_fma(auVar72,auVar199,auVar68);
                        auVar67 = vshufps_avx(auVar199,auVar199,0xc9);
                        auVar69 = vshufps_avx(auVar68,auVar68,0xc9);
                        auVar200._0_4_ = auVar199._0_4_ * auVar69._0_4_;
                        auVar200._4_4_ = auVar199._4_4_ * auVar69._4_4_;
                        auVar200._8_4_ = auVar199._8_4_ * auVar69._8_4_;
                        auVar200._12_4_ = auVar199._12_4_ * auVar69._12_4_;
                        auVar68 = vfmsub231ps_fma(auVar200,auVar68,auVar67);
                        auVar67 = vshufps_avx(auVar68,auVar68,0xc9);
                        auVar69 = vshufps_avx(auVar75,auVar75,0xc9);
                        auVar68 = vshufps_avx(auVar68,auVar68,0xd2);
                        auVar151._0_4_ = auVar75._0_4_ * auVar68._0_4_;
                        auVar151._4_4_ = auVar75._4_4_ * auVar68._4_4_;
                        auVar151._8_4_ = auVar75._8_4_ * auVar68._8_4_;
                        auVar151._12_4_ = auVar75._12_4_ * auVar68._12_4_;
                        auVar67 = vfmsub231ps_fma(auVar151,auVar67,auVar69);
                        auVar252 = vbroadcastss_avx512f(ZEXT416(1));
                        local_340 = vpermps_avx512f(auVar252,auVar260);
                        auVar252 = vpermps_avx512f(auVar252,ZEXT1664(auVar67));
                        auVar260 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar260,ZEXT1664(auVar67));
                        local_380 = vbroadcastss_avx512f(auVar67);
                        local_400[0] = (RTCHitN)auVar252[0];
                        local_400[1] = (RTCHitN)auVar252[1];
                        local_400[2] = (RTCHitN)auVar252[2];
                        local_400[3] = (RTCHitN)auVar252[3];
                        local_400[4] = (RTCHitN)auVar252[4];
                        local_400[5] = (RTCHitN)auVar252[5];
                        local_400[6] = (RTCHitN)auVar252[6];
                        local_400[7] = (RTCHitN)auVar252[7];
                        local_400[8] = (RTCHitN)auVar252[8];
                        local_400[9] = (RTCHitN)auVar252[9];
                        local_400[10] = (RTCHitN)auVar252[10];
                        local_400[0xb] = (RTCHitN)auVar252[0xb];
                        local_400[0xc] = (RTCHitN)auVar252[0xc];
                        local_400[0xd] = (RTCHitN)auVar252[0xd];
                        local_400[0xe] = (RTCHitN)auVar252[0xe];
                        local_400[0xf] = (RTCHitN)auVar252[0xf];
                        local_400[0x10] = (RTCHitN)auVar252[0x10];
                        local_400[0x11] = (RTCHitN)auVar252[0x11];
                        local_400[0x12] = (RTCHitN)auVar252[0x12];
                        local_400[0x13] = (RTCHitN)auVar252[0x13];
                        local_400[0x14] = (RTCHitN)auVar252[0x14];
                        local_400[0x15] = (RTCHitN)auVar252[0x15];
                        local_400[0x16] = (RTCHitN)auVar252[0x16];
                        local_400[0x17] = (RTCHitN)auVar252[0x17];
                        local_400[0x18] = (RTCHitN)auVar252[0x18];
                        local_400[0x19] = (RTCHitN)auVar252[0x19];
                        local_400[0x1a] = (RTCHitN)auVar252[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar252[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar252[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar252[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar252[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar252[0x1f];
                        local_400[0x20] = (RTCHitN)auVar252[0x20];
                        local_400[0x21] = (RTCHitN)auVar252[0x21];
                        local_400[0x22] = (RTCHitN)auVar252[0x22];
                        local_400[0x23] = (RTCHitN)auVar252[0x23];
                        local_400[0x24] = (RTCHitN)auVar252[0x24];
                        local_400[0x25] = (RTCHitN)auVar252[0x25];
                        local_400[0x26] = (RTCHitN)auVar252[0x26];
                        local_400[0x27] = (RTCHitN)auVar252[0x27];
                        local_400[0x28] = (RTCHitN)auVar252[0x28];
                        local_400[0x29] = (RTCHitN)auVar252[0x29];
                        local_400[0x2a] = (RTCHitN)auVar252[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar252[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar252[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar252[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar252[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar252[0x2f];
                        local_400[0x30] = (RTCHitN)auVar252[0x30];
                        local_400[0x31] = (RTCHitN)auVar252[0x31];
                        local_400[0x32] = (RTCHitN)auVar252[0x32];
                        local_400[0x33] = (RTCHitN)auVar252[0x33];
                        local_400[0x34] = (RTCHitN)auVar252[0x34];
                        local_400[0x35] = (RTCHitN)auVar252[0x35];
                        local_400[0x36] = (RTCHitN)auVar252[0x36];
                        local_400[0x37] = (RTCHitN)auVar252[0x37];
                        local_400[0x38] = (RTCHitN)auVar252[0x38];
                        local_400[0x39] = (RTCHitN)auVar252[0x39];
                        local_400[0x3a] = (RTCHitN)auVar252[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar252[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar252[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar252[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar252[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar252[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_480._0_8_;
                        uStack_2b8 = local_480._8_8_;
                        uStack_2b0 = local_480._16_8_;
                        uStack_2a8 = local_480._24_8_;
                        uStack_2a0 = local_480._32_8_;
                        uStack_298 = local_480._40_8_;
                        uStack_290 = local_480._48_8_;
                        uStack_288 = local_480._56_8_;
                        auVar252 = vmovdqa64_avx512f(local_4c0);
                        local_280 = vmovdqa64_avx512f(auVar252);
                        vpcmpeqd_avx2(auVar252._0_32_,auVar252._0_32_);
                        local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar205;
                        auVar260 = vmovdqa64_avx512f(local_500);
                        local_7c0 = vmovdqa64_avx512f(auVar260);
                        local_a70.valid = (int *)local_7c0;
                        local_a70.geometryUserPtr = pGVar2->userPtr;
                        local_a70.context = context->user;
                        local_a70.hit = local_400;
                        local_a70.N = 0x10;
                        local_a70.ray = (RTCRayN *)ray;
                        if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar256 = ZEXT1664(auVar255);
                          auVar261 = ZEXT1664(auVar11);
                          auVar262 = ZEXT1664(auVar149);
                          (*pGVar2->occlusionFilterN)(&local_a70);
                          auVar159 = ZEXT3264(_local_a40);
                          auVar260 = vmovdqa64_avx512f(local_7c0);
                        }
                        uVar12 = vptestmd_avx512f(auVar260,auVar260);
                        if ((short)uVar12 != 0) {
                          p_Var3 = context->args->filter;
                          if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar256 = ZEXT1664(auVar256._0_16_);
                            auVar261 = ZEXT1664(auVar261._0_16_);
                            auVar262 = ZEXT1664(auVar262._0_16_);
                            (*p_Var3)(&local_a70);
                            auVar159 = ZEXT3264(_local_a40);
                            auVar260 = vmovdqa64_avx512f(local_7c0);
                          }
                          auVar252 = ZEXT464((uint)fVar221);
                          uVar60 = vptestmd_avx512f(auVar260,auVar260);
                          auVar260 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar4 = (bool)((byte)uVar60 & 1);
                          auVar134._0_4_ =
                               (uint)bVar4 * auVar260._0_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x200);
                          bVar4 = (bool)((byte)(uVar60 >> 1) & 1);
                          auVar134._4_4_ =
                               (uint)bVar4 * auVar260._4_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x204);
                          bVar4 = (bool)((byte)(uVar60 >> 2) & 1);
                          auVar134._8_4_ =
                               (uint)bVar4 * auVar260._8_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x208);
                          bVar4 = (bool)((byte)(uVar60 >> 3) & 1);
                          auVar134._12_4_ =
                               (uint)bVar4 * auVar260._12_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x20c);
                          bVar4 = (bool)((byte)(uVar60 >> 4) & 1);
                          auVar134._16_4_ =
                               (uint)bVar4 * auVar260._16_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x210);
                          bVar4 = (bool)((byte)(uVar60 >> 5) & 1);
                          auVar134._20_4_ =
                               (uint)bVar4 * auVar260._20_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x214);
                          bVar4 = (bool)((byte)(uVar60 >> 6) & 1);
                          auVar134._24_4_ =
                               (uint)bVar4 * auVar260._24_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x218);
                          bVar4 = (bool)((byte)(uVar60 >> 7) & 1);
                          auVar134._28_4_ =
                               (uint)bVar4 * auVar260._28_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x21c);
                          bVar4 = (bool)((byte)(uVar60 >> 8) & 1);
                          auVar134._32_4_ =
                               (uint)bVar4 * auVar260._32_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x220);
                          bVar4 = (bool)((byte)(uVar60 >> 9) & 1);
                          auVar134._36_4_ =
                               (uint)bVar4 * auVar260._36_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x224);
                          bVar4 = (bool)((byte)(uVar60 >> 10) & 1);
                          auVar134._40_4_ =
                               (uint)bVar4 * auVar260._40_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x228);
                          bVar4 = (bool)((byte)(uVar60 >> 0xb) & 1);
                          auVar134._44_4_ =
                               (uint)bVar4 * auVar260._44_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x22c);
                          bVar4 = (bool)((byte)(uVar60 >> 0xc) & 1);
                          auVar134._48_4_ =
                               (uint)bVar4 * auVar260._48_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x230);
                          bVar4 = (bool)((byte)(uVar60 >> 0xd) & 1);
                          auVar134._52_4_ =
                               (uint)bVar4 * auVar260._52_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x234);
                          bVar4 = (bool)((byte)(uVar60 >> 0xe) & 1);
                          auVar134._56_4_ =
                               (uint)bVar4 * auVar260._56_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x238);
                          bVar4 = SUB81(uVar60 >> 0xf,0);
                          auVar134._60_4_ =
                               (uint)bVar4 * auVar260._60_4_ |
                               (uint)!bVar4 * *(int *)(local_a70.ray + 0x23c);
                          *(undefined1 (*) [64])(local_a70.ray + 0x200) = auVar134;
                          bVar57 = 1;
                          if ((short)uVar60 != 0) goto LAB_01acc4d6;
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar221;
                      }
                      auVar252 = ZEXT464((uint)fVar221);
                      bVar57 = 0;
                      goto LAB_01acc4d6;
                    }
                  }
                  bVar59 = uVar60 < 4;
                  uVar60 = uVar60 + 1;
                } while (uVar60 != 5);
                bVar59 = false;
                bVar57 = 5;
LAB_01acc4cd:
                auVar159 = ZEXT3264(_local_a40);
LAB_01acc4d6:
                bVar56 = (bool)(bVar56 | bVar59 & bVar57);
                uVar162 = *(undefined4 *)(ray + k * 4 + 0x200);
                auVar157._4_4_ = uVar162;
                auVar157._0_4_ = uVar162;
                auVar157._8_4_ = uVar162;
                auVar157._12_4_ = uVar162;
                auVar157._16_4_ = uVar162;
                auVar157._20_4_ = uVar162;
                auVar157._24_4_ = uVar162;
                auVar157._28_4_ = uVar162;
                auVar45._4_4_ = fStack_73c;
                auVar45._0_4_ = local_740;
                auVar45._8_4_ = fStack_738;
                auVar45._12_4_ = fStack_734;
                auVar45._16_4_ = fStack_730;
                auVar45._20_4_ = fStack_72c;
                auVar45._24_4_ = fStack_728;
                auVar45._28_4_ = fStack_724;
                uVar12 = vcmpps_avx512vl(auVar157,auVar45,0xd);
                bVar54 = ~('\x01' << ((byte)iVar15 & 0x1f)) & bVar54 & (byte)uVar12;
                auVar126 = local_760;
              } while (bVar54 != 0);
            }
            uVar13 = vpcmpgtd_avx512vl(auVar126,local_700);
            uVar14 = vpcmpd_avx512vl(local_700,local_680,1);
            auVar203._0_4_ = fVar161 + (float)local_440._0_4_;
            auVar203._4_4_ = fVar161 + (float)local_440._4_4_;
            auVar203._8_4_ = fVar161 + fStack_438;
            auVar203._12_4_ = fVar161 + fStack_434;
            auVar203._16_4_ = fVar161 + fStack_430;
            auVar203._20_4_ = fVar161 + fStack_42c;
            auVar203._24_4_ = fVar161 + fStack_428;
            auVar203._28_4_ = fVar161 + fStack_424;
            uVar12 = vcmpps_avx512vl(auVar203,auVar157,2);
            bVar51 = bVar51 & (byte)uVar14 & (byte)uVar12;
            auVar204._0_4_ = fVar161 + local_6e0._0_4_;
            auVar204._4_4_ = fVar161 + local_6e0._4_4_;
            auVar204._8_4_ = fVar161 + local_6e0._8_4_;
            auVar204._12_4_ = fVar161 + local_6e0._12_4_;
            auVar204._16_4_ = fVar161 + local_6e0._16_4_;
            auVar204._20_4_ = fVar161 + local_6e0._20_4_;
            auVar204._24_4_ = fVar161 + local_6e0._24_4_;
            auVar204._28_4_ = fVar161 + local_6e0._28_4_;
            uVar12 = vcmpps_avx512vl(auVar204,auVar157,2);
            bVar47 = bVar47 & (byte)uVar13 & (byte)uVar12 | bVar51;
            prim = local_8f0;
            if (bVar47 != 0) {
              uVar50 = (ulong)uVar53;
              abStack_1a0[uVar50 * 0x60] = bVar47;
              auVar128._0_4_ =
                   (uint)(bVar51 & 1) * local_440._0_4_ |
                   (uint)!(bool)(bVar51 & 1) * (int)local_6e0._0_4_;
              bVar59 = (bool)(bVar51 >> 1 & 1);
              auVar128._4_4_ = (uint)bVar59 * local_440._4_4_ | (uint)!bVar59 * (int)local_6e0._4_4_
              ;
              bVar59 = (bool)(bVar51 >> 2 & 1);
              auVar128._8_4_ = (uint)bVar59 * (int)fStack_438 | (uint)!bVar59 * (int)local_6e0._8_4_
              ;
              bVar59 = (bool)(bVar51 >> 3 & 1);
              auVar128._12_4_ =
                   (uint)bVar59 * (int)fStack_434 | (uint)!bVar59 * (int)local_6e0._12_4_;
              bVar59 = (bool)(bVar51 >> 4 & 1);
              auVar128._16_4_ =
                   (uint)bVar59 * (int)fStack_430 | (uint)!bVar59 * (int)local_6e0._16_4_;
              bVar59 = (bool)(bVar51 >> 5 & 1);
              auVar128._20_4_ =
                   (uint)bVar59 * (int)fStack_42c | (uint)!bVar59 * (int)local_6e0._20_4_;
              auVar128._24_4_ =
                   (uint)(bVar51 >> 6) * (int)fStack_428 |
                   (uint)!(bool)(bVar51 >> 6) * (int)local_6e0._24_4_;
              auVar128._28_4_ = local_6e0._28_4_;
              *(undefined1 (*) [32])(auStack_180 + uVar50 * 0x60) = auVar128;
              uVar60 = vmovlps_avx(local_710);
              (&uStack_160)[uVar50 * 0xc] = uVar60;
              aiStack_158[uVar50 * 0x18] = local_cfc + 1;
              uVar53 = uVar53 + 1;
            }
          }
        }
      }
    }
    do {
      uVar62 = uVar53;
      uVar61 = uVar62 - 1;
      if (uVar62 == 0) {
        if (bVar56 != false) {
          return bVar56;
        }
        uVar162 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar25._4_4_ = uVar162;
        auVar25._0_4_ = uVar162;
        auVar25._8_4_ = uVar162;
        auVar25._12_4_ = uVar162;
        uVar12 = vcmpps_avx512vl(local_720,auVar25,2);
        uVar58 = (uint)local_8e8 & (uint)uVar12;
        local_8e8 = (ulong)uVar58;
        if (uVar58 == 0) {
          return false;
        }
        goto LAB_01ac9fd8;
      }
      uVar60 = (ulong)uVar61;
      lVar52 = uVar60 * 0x60;
      auVar86 = *(undefined1 (*) [32])(auStack_180 + lVar52);
      auVar176._0_4_ = fVar161 + auVar86._0_4_;
      auVar176._4_4_ = fVar161 + auVar86._4_4_;
      auVar176._8_4_ = fVar161 + auVar86._8_4_;
      auVar176._12_4_ = fVar161 + auVar86._12_4_;
      auVar176._16_4_ = fVar161 + auVar86._16_4_;
      auVar176._20_4_ = fVar161 + auVar86._20_4_;
      auVar176._24_4_ = fVar161 + auVar86._24_4_;
      auVar176._28_4_ = fVar161 + auVar86._28_4_;
      uVar162 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar29._4_4_ = uVar162;
      auVar29._0_4_ = uVar162;
      auVar29._8_4_ = uVar162;
      auVar29._12_4_ = uVar162;
      auVar29._16_4_ = uVar162;
      auVar29._20_4_ = uVar162;
      auVar29._24_4_ = uVar162;
      auVar29._28_4_ = uVar162;
      uVar12 = vcmpps_avx512vl(auVar176,auVar29,2);
      uVar135 = (uint)uVar12 & (uint)abStack_1a0[lVar52];
      uVar53 = uVar61;
    } while (uVar135 == 0);
    uVar50 = (&uStack_160)[uVar60 * 0xc];
    auVar165._8_8_ = 0;
    auVar165._0_8_ = uVar50;
    auVar202._8_4_ = 0x7f800000;
    auVar202._0_8_ = 0x7f8000007f800000;
    auVar202._12_4_ = 0x7f800000;
    auVar202._16_4_ = 0x7f800000;
    auVar202._20_4_ = 0x7f800000;
    auVar202._24_4_ = 0x7f800000;
    auVar202._28_4_ = 0x7f800000;
    auVar87 = vblendmps_avx512vl(auVar202,auVar86);
    bVar47 = (byte)uVar135;
    auVar124._0_4_ =
         (uint)(bVar47 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar47 & 1) * (int)auVar86._0_4_;
    bVar59 = (bool)((byte)(uVar135 >> 1) & 1);
    auVar124._4_4_ = (uint)bVar59 * auVar87._4_4_ | (uint)!bVar59 * (int)auVar86._4_4_;
    bVar59 = (bool)((byte)(uVar135 >> 2) & 1);
    auVar124._8_4_ = (uint)bVar59 * auVar87._8_4_ | (uint)!bVar59 * (int)auVar86._8_4_;
    bVar59 = (bool)((byte)(uVar135 >> 3) & 1);
    auVar124._12_4_ = (uint)bVar59 * auVar87._12_4_ | (uint)!bVar59 * (int)auVar86._12_4_;
    bVar59 = (bool)((byte)(uVar135 >> 4) & 1);
    auVar124._16_4_ = (uint)bVar59 * auVar87._16_4_ | (uint)!bVar59 * (int)auVar86._16_4_;
    bVar59 = (bool)((byte)(uVar135 >> 5) & 1);
    auVar124._20_4_ = (uint)bVar59 * auVar87._20_4_ | (uint)!bVar59 * (int)auVar86._20_4_;
    bVar59 = (bool)((byte)(uVar135 >> 6) & 1);
    auVar124._24_4_ = (uint)bVar59 * auVar87._24_4_ | (uint)!bVar59 * (int)auVar86._24_4_;
    auVar124._28_4_ =
         (uVar135 >> 7) * auVar87._28_4_ | (uint)!SUB41(uVar135 >> 7,0) * (int)auVar86._28_4_;
    auVar86 = vshufps_avx(auVar124,auVar124,0xb1);
    auVar86 = vminps_avx(auVar124,auVar86);
    auVar87 = vshufpd_avx(auVar86,auVar86,5);
    auVar86 = vminps_avx(auVar86,auVar87);
    auVar87 = vpermpd_avx2(auVar86,0x4e);
    auVar86 = vminps_avx(auVar86,auVar87);
    uVar12 = vcmpps_avx512vl(auVar124,auVar86,0);
    bVar54 = (byte)uVar12 & bVar47;
    if (bVar54 != 0) {
      uVar135 = (uint)bVar54;
    }
    uVar136 = 0;
    for (; (uVar135 & 1) == 0; uVar135 = uVar135 >> 1 | 0x80000000) {
      uVar136 = uVar136 + 1;
    }
    local_cfc = aiStack_158[uVar60 * 0x18];
    bVar47 = ~('\x01' << ((byte)uVar136 & 0x1f)) & bVar47;
    abStack_1a0[lVar52] = bVar47;
    uVar53 = uVar62;
    if (bVar47 == 0) {
      uVar53 = uVar61;
    }
    uVar162 = (undefined4)uVar50;
    auVar154._4_4_ = uVar162;
    auVar154._0_4_ = uVar162;
    auVar154._8_4_ = uVar162;
    auVar154._12_4_ = uVar162;
    auVar154._16_4_ = uVar162;
    auVar154._20_4_ = uVar162;
    auVar154._24_4_ = uVar162;
    auVar154._28_4_ = uVar162;
    auVar67 = vmovshdup_avx(auVar165);
    auVar67 = vsubps_avx(auVar67,auVar165);
    auVar177._0_4_ = auVar67._0_4_;
    auVar177._4_4_ = auVar177._0_4_;
    auVar177._8_4_ = auVar177._0_4_;
    auVar177._12_4_ = auVar177._0_4_;
    auVar177._16_4_ = auVar177._0_4_;
    auVar177._20_4_ = auVar177._0_4_;
    auVar177._24_4_ = auVar177._0_4_;
    auVar177._28_4_ = auVar177._0_4_;
    auVar67 = vfmadd132ps_fma(auVar177,auVar154,_DAT_01faff20);
    auVar86 = ZEXT1632(auVar67);
    local_400[0] = (RTCHitN)auVar86[0];
    local_400[1] = (RTCHitN)auVar86[1];
    local_400[2] = (RTCHitN)auVar86[2];
    local_400[3] = (RTCHitN)auVar86[3];
    local_400[4] = (RTCHitN)auVar86[4];
    local_400[5] = (RTCHitN)auVar86[5];
    local_400[6] = (RTCHitN)auVar86[6];
    local_400[7] = (RTCHitN)auVar86[7];
    local_400[8] = (RTCHitN)auVar86[8];
    local_400[9] = (RTCHitN)auVar86[9];
    local_400[10] = (RTCHitN)auVar86[10];
    local_400[0xb] = (RTCHitN)auVar86[0xb];
    local_400[0xc] = (RTCHitN)auVar86[0xc];
    local_400[0xd] = (RTCHitN)auVar86[0xd];
    local_400[0xe] = (RTCHitN)auVar86[0xe];
    local_400[0xf] = (RTCHitN)auVar86[0xf];
    local_400[0x10] = (RTCHitN)auVar86[0x10];
    local_400[0x11] = (RTCHitN)auVar86[0x11];
    local_400[0x12] = (RTCHitN)auVar86[0x12];
    local_400[0x13] = (RTCHitN)auVar86[0x13];
    local_400[0x14] = (RTCHitN)auVar86[0x14];
    local_400[0x15] = (RTCHitN)auVar86[0x15];
    local_400[0x16] = (RTCHitN)auVar86[0x16];
    local_400[0x17] = (RTCHitN)auVar86[0x17];
    local_400[0x18] = (RTCHitN)auVar86[0x18];
    local_400[0x19] = (RTCHitN)auVar86[0x19];
    local_400[0x1a] = (RTCHitN)auVar86[0x1a];
    local_400[0x1b] = (RTCHitN)auVar86[0x1b];
    local_400[0x1c] = (RTCHitN)auVar86[0x1c];
    local_400[0x1d] = (RTCHitN)auVar86[0x1d];
    local_400[0x1e] = (RTCHitN)auVar86[0x1e];
    local_400[0x1f] = (RTCHitN)auVar86[0x1f];
    local_710._8_8_ = 0;
    local_710._0_8_ = *(ulong *)(local_400 + (ulong)uVar136 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }